

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins.cpp
# Opt level: O1

RPCHelpMan * wallet::listunspent(void)

{
  size_type *psVar1;
  ulong *puVar2;
  string name;
  string name_00;
  string name_01;
  string name_02;
  string name_03;
  string name_04;
  string name_05;
  string name_06;
  string name_07;
  string name_08;
  string name_09;
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  string m_key_name_03;
  string m_key_name_04;
  string m_key_name_05;
  string m_key_name_06;
  string m_key_name_07;
  string m_key_name_08;
  string m_key_name_09;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  string description_05;
  string description_06;
  string description_07;
  string description_08;
  string description_09;
  string description_10;
  string description_11;
  string description_12;
  string description_13;
  string description_14;
  string description_15;
  string description_16;
  string description_17;
  string description_18;
  string description_19;
  string description_20;
  Fallback fallback;
  Fallback fallback_00;
  Fallback fallback_01;
  Fallback fallback_02;
  Fallback fallback_03;
  Fallback fallback_04;
  Fallback fallback_05;
  Fallback fallback_06;
  Fallback fallback_07;
  Fallback fallback_08;
  Fallback fallback_09;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_04;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_05;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_06;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_07;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_08;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_09;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_10;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_11;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_12;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_13;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_14;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_15;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_16;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_17;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_18;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_19;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCResults results;
  RPCExamples examples;
  string description_21;
  string description_22;
  string description_23;
  string description_24;
  string description_25;
  string description_26;
  string description_27;
  string description_28;
  string description_29;
  string description_30;
  string description_31;
  vector<RPCArg,_std::allocator<RPCArg>_> inner_20;
  vector<RPCArg,_std::allocator<RPCArg>_> inner_21;
  RPCArgOptions opts;
  RPCArgOptions opts_00;
  RPCArgOptions opts_01;
  RPCArgOptions opts_02;
  RPCArgOptions opts_03;
  RPCArgOptions opts_04;
  RPCArgOptions opts_05;
  RPCArgOptions opts_06;
  RPCArgOptions opts_07;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  undefined8 uVar16;
  RPCHelpMan *in_RDI;
  long lVar17;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  initializer_list<RPCArg> __l_00;
  initializer_list<RPCArg> __l_01;
  initializer_list<RPCResult> __l_02;
  initializer_list<RPCResult> __l_03;
  initializer_list<RPCResult> __l_04;
  undefined4 in_stack_ffffffffffffd028;
  undefined4 uVar18;
  undefined4 in_stack_ffffffffffffd02c;
  undefined1 *puVar19;
  undefined4 uVar20;
  undefined8 in_stack_ffffffffffffd038;
  undefined8 in_stack_ffffffffffffd040;
  undefined8 in_stack_ffffffffffffd048;
  code *pcVar21;
  undefined8 in_stack_ffffffffffffd050;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_ffffffffffffd058;
  pointer in_stack_ffffffffffffd068;
  pointer pRVar22;
  pointer in_stack_ffffffffffffd070;
  pointer pRVar23;
  pointer in_stack_ffffffffffffd078;
  pointer pRVar24;
  undefined8 in_stack_ffffffffffffd080;
  pointer in_stack_ffffffffffffd088;
  pointer pRVar25;
  pointer in_stack_ffffffffffffd090;
  pointer pRVar26;
  pointer in_stack_ffffffffffffd098;
  pointer pRVar27;
  pointer in_stack_ffffffffffffd0a0;
  pointer in_stack_ffffffffffffd0a8;
  pointer in_stack_ffffffffffffd0b0;
  pointer in_stack_ffffffffffffd0b8;
  pointer in_stack_ffffffffffffd0c0;
  pointer in_stack_ffffffffffffd0c8;
  undefined8 in_stack_ffffffffffffd0d0;
  pointer in_stack_ffffffffffffd0d8;
  pointer in_stack_ffffffffffffd0e0;
  pointer in_stack_ffffffffffffd0e8;
  undefined8 in_stack_ffffffffffffd0f0;
  pointer in_stack_ffffffffffffd0f8;
  pointer in_stack_ffffffffffffd100;
  pointer in_stack_ffffffffffffd108;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2ee8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2ec8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2ea8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2e88;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2e68;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2e48;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2e28;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2e08;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2de8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2dc8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2da8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2d88;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2d68;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2d48;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2d30;
  RPCResults local_2d18;
  allocator_type local_2cfb;
  allocator_type local_2cfa;
  bool local_2cf9;
  vector<RPCArg,_std::allocator<RPCArg>_> local_2cf8;
  bool local_2cda;
  allocator_type local_2cd9;
  vector<RPCArg,_std::allocator<RPCArg>_> local_2cd8;
  int local_2cc0 [2];
  vector<RPCArg,_std::allocator<RPCArg>_> local_2cb8;
  string local_2ca0;
  string local_2c80;
  string local_2c60;
  string local_2c40;
  string local_2c20;
  string local_2c00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2be0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2bc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2ba0;
  string local_2b80;
  string local_2b60;
  string local_2b40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2ae0;
  string local_2ac0;
  string local_2aa0;
  string local_2a80;
  string local_2a60;
  string local_2a40;
  string local_2a20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_29e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_29c0;
  ulong *local_29a0;
  undefined8 local_2998;
  ulong local_2990;
  undefined8 uStack_2988;
  ulong *local_2980;
  size_type local_2978;
  ulong local_2970;
  undefined8 uStack_2968;
  long *local_2960 [2];
  long local_2950 [2];
  long *local_2940 [2];
  long local_2930 [2];
  long *local_2920 [2];
  long local_2910 [2];
  long *local_2900 [2];
  long local_28f0 [2];
  RPCResult local_28e0;
  long *local_2858 [2];
  long local_2848 [2];
  long *local_2838 [2];
  long local_2828 [2];
  long *local_2818 [2];
  long local_2808 [2];
  long *local_27f8 [2];
  long local_27e8 [2];
  long *local_27d8 [2];
  long local_27c8 [2];
  long *local_27b8 [2];
  long local_27a8 [2];
  long *local_2798 [2];
  long local_2788 [2];
  long *local_2778 [2];
  long local_2768 [2];
  long *local_2758 [2];
  long local_2748 [2];
  long *local_2738 [2];
  long local_2728 [2];
  long *local_2718 [2];
  long local_2708 [2];
  long *local_26f8 [2];
  long local_26e8 [2];
  long *local_26d8 [2];
  long local_26c8 [2];
  long *local_26b8 [2];
  long local_26a8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2698;
  size_type *local_2678;
  size_type local_2670;
  size_type local_2668;
  undefined8 uStack_2660;
  long *local_2658 [2];
  long local_2648 [2];
  long *local_2638 [2];
  long local_2628 [2];
  long *local_2618 [2];
  long local_2608 [2];
  long *local_25f8 [2];
  long local_25e8 [2];
  long *local_25d8 [2];
  long local_25c8 [2];
  long *local_25b8 [2];
  long local_25a8 [2];
  long *local_2598 [2];
  long local_2588 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2578;
  long *local_2558 [2];
  long local_2548 [2];
  long *local_2538 [2];
  long local_2528 [2];
  long *local_2518 [2];
  long local_2508 [2];
  long *local_24f8 [2];
  long local_24e8 [2];
  long *local_24d8 [2];
  long local_24c8 [2];
  long *local_24b8 [2];
  long local_24a8 [2];
  long *local_2498 [2];
  long local_2488 [2];
  long *local_2478 [2];
  long local_2468 [2];
  vector<RPCResult,_std::allocator<RPCResult>_> local_2458;
  long *local_2438 [2];
  long local_2428 [2];
  pointer local_2418 [2];
  undefined1 local_2408 [152];
  RPCResult local_2370;
  RPCResult local_22e8;
  RPCResult local_2260;
  RPCResult local_21d8;
  RPCResult local_2150;
  RPCResult local_20c8;
  RPCResult local_2040;
  RPCResult local_1fb8;
  RPCResult local_1f30;
  RPCResult local_1ea8;
  RPCResult local_1e20;
  RPCResult local_1d98;
  RPCResult local_1d10;
  RPCResult local_1c88;
  RPCResult local_1c00;
  RPCResult local_1b78;
  RPCResult local_1af0;
  long *local_1a68 [2];
  long local_1a58 [2];
  long *local_1a48 [2];
  long local_1a38 [2];
  RPCResult local_1a28;
  long *local_19a0 [2];
  long local_1990 [2];
  long *local_1980 [2];
  long local_1970 [2];
  RPCResult local_1960;
  undefined1 local_18d8 [8];
  long *local_18d0 [2];
  long local_18c0 [2];
  undefined1 local_18b0 [32];
  undefined1 local_1890;
  undefined1 *local_1888;
  undefined8 local_1880;
  undefined1 local_1878;
  undefined7 uStack_1877;
  undefined1 local_1868 [32];
  long *local_1848 [2];
  long local_1838 [2];
  UniValue local_1828;
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_17d0;
  undefined1 local_1778;
  long *local_1770 [2];
  long local_1760 [2];
  undefined1 local_1750;
  undefined1 *local_1748;
  undefined8 local_1740;
  undefined1 local_1738;
  undefined7 uStack_1737;
  undefined1 local_1728 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1708;
  size_type *local_16e8;
  size_type local_16e0;
  size_type local_16d8;
  undefined8 uStack_16d0;
  undefined1 *local_16c8;
  undefined8 local_16c0;
  undefined1 local_16b8;
  undefined7 uStack_16b7;
  undefined8 uStack_16b0;
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_16a8;
  undefined1 local_1650;
  long *local_1648 [2];
  long local_1638 [2];
  undefined1 local_1628;
  undefined1 *local_1620;
  undefined8 local_1618;
  undefined1 local_1610;
  undefined7 uStack_160f;
  undefined1 local_1600 [32];
  long *local_15e0 [2];
  long local_15d0 [2];
  uint *local_15c0;
  undefined8 local_15b8;
  uint local_15b0;
  undefined4 uStack_15ac;
  undefined4 uStack_15a8;
  undefined4 uStack_15a4;
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_15a0;
  undefined1 local_1548;
  long *local_1540 [2];
  long local_1530 [2];
  undefined1 local_1520;
  undefined1 *local_1518;
  undefined8 local_1510;
  undefined1 local_1508;
  undefined7 uStack_1507;
  undefined1 local_14f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_14d8;
  size_type *local_14b8;
  size_type local_14b0;
  size_type local_14a8;
  undefined8 uStack_14a0;
  undefined1 *local_1498;
  undefined8 local_1490;
  undefined1 local_1488;
  undefined7 uStack_1487;
  undefined8 uStack_1480;
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_1478;
  undefined1 local_1420;
  long *local_1418 [2];
  long local_1408 [2];
  undefined1 local_13f8;
  undefined1 *local_13f0;
  undefined8 local_13e8;
  undefined1 local_13e0;
  undefined7 uStack_13df;
  undefined1 local_13d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_13b0;
  size_type *local_1390;
  size_type local_1388;
  size_type local_1380 [2];
  undefined1 local_1370 [32];
  undefined1 local_1350 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1338;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1328;
  vector<UniValue,_std::allocator<UniValue>_> local_1310;
  undefined1 local_12f8 [40];
  long local_12d0 [6];
  __index_type local_12a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1298;
  RPCArg local_1278;
  RPCArg local_1170;
  RPCArg local_1068;
  RPCArg local_f60;
  RPCArg local_e58;
  long *local_d50 [2];
  long local_d40 [2];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_d30;
  undefined1 local_cd8;
  long *local_cd0 [2];
  long local_cc0 [2];
  undefined1 local_cb0;
  undefined1 *local_ca8;
  undefined8 local_ca0;
  undefined1 local_c98;
  undefined7 uStack_c97;
  undefined1 local_c88 [32];
  long *local_c68 [2];
  long local_c58 [2];
  UniValue local_c48;
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_bf0;
  undefined1 local_b98;
  long *local_b90 [2];
  long local_b80 [2];
  undefined1 local_b70 [8];
  undefined1 *local_b68;
  undefined8 local_b60;
  undefined1 local_b58;
  undefined7 uStack_b57;
  undefined1 local_b48 [32];
  undefined1 local_b28;
  undefined1 *local_b20;
  undefined8 local_b18;
  undefined1 local_b10;
  undefined7 uStack_b0f;
  undefined1 local_b00 [32];
  long *local_ae0 [2];
  long local_ad0 [2];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_ac0;
  undefined1 local_a68;
  long *local_a60 [2];
  long local_a50 [2];
  RPCArg local_a40;
  long *local_938 [2];
  long local_928 [2];
  undefined1 *local_918;
  undefined8 local_910;
  undefined1 local_908;
  uint7 uStack_907;
  undefined4 local_8ff;
  undefined2 local_8fb;
  undefined1 local_8f9;
  undefined4 local_8f8;
  undefined1 *local_8f0;
  undefined8 local_8e8;
  undefined1 local_8e0;
  uint7 uStack_8df;
  undefined4 uStack_8d7;
  undefined2 uStack_8d3;
  undefined1 uStack_8d1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_8d0;
  vector<UniValue,_std::allocator<UniValue>_> vStack_8b8;
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_8a0;
  undefined1 local_848;
  long *local_840 [2];
  long local_830 [2];
  undefined1 local_820;
  undefined1 *local_818;
  undefined8 local_810;
  undefined1 local_808;
  undefined7 uStack_807;
  undefined1 local_7f8 [32];
  long *local_7d8 [2];
  long local_7c8 [2];
  UniValue local_7b8;
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_760;
  undefined1 local_708;
  long *local_700 [2];
  long local_6f0 [2];
  undefined1 local_6e0;
  undefined1 *local_6d8;
  undefined8 local_6d0;
  undefined1 local_6c8;
  undefined7 uStack_6c7;
  undefined1 local_6b8 [32];
  long *local_698 [2];
  long local_688;
  undefined1 auStack_680 [8];
  undefined1 local_678 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_660;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_650;
  vector<UniValue,_std::allocator<UniValue>_> local_638;
  undefined1 local_620 [40];
  long local_5f8 [6];
  __index_type local_5c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_5c0;
  RPCArg local_5a0;
  RPCArg local_498;
  RPCArg local_390;
  RPCArg local_288;
  RPCArg local_180;
  long *local_78 [2];
  long local_68 [2];
  _Any_data local_58;
  _Manager_type local_48 [2];
  long local_38;
  
  local_1068.m_inner.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2040.m_key_name._M_string_length = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_unused._M_object = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"listunspent","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,
             "\nReturns array of unspent transaction outputs\nwith between minconf and maxconf (inclusive) confirmations.\nOptionally filter to only include txouts paid to specified addresses.\n"
             ,"");
  local_5c0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((long)&local_5c0.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5c0,"minconf","");
  local_2cc0[1] = 1;
  ::UniValue::UniValue<int,_int,_true>((UniValue *)local_678,local_2cc0 + 1);
  local_620._8_8_ = local_620 + 0x18;
  local_620._0_4_ = local_678._0_4_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_678._8_8_ == &local_660) {
    local_620._32_8_ = local_660._8_8_;
  }
  else {
    local_620._8_8_ = local_678._8_8_;
  }
  local_620._16_8_ = local_678._16_8_;
  local_678._16_8_ = 0;
  local_660._M_local_buf[0] = '\0';
  local_5f8[0] = (long)local_650.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
  local_5f8[1] = (long)local_650.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
  local_5f8[2] = (long)local_650.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_650.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_650.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_650.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_5f8[3]._0_4_ =
       local_638.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  local_5f8[3]._4_4_ =
       local_638.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  local_5f8[4]._0_4_ =
       local_638.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._0_4_;
  local_5f8[4]._4_4_ =
       local_638.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._4_4_;
  local_5f8[5] = (long)local_638.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
  local_638.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_638.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_638.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_5c8 = '\x02';
  local_698[0] = &local_688;
  local_678._8_8_ = &local_660;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_698,"The minimum confirmations to filter","");
  local_6d8 = &local_6c8;
  local_6e0 = 0;
  local_6d0 = 0;
  local_6c8 = 0;
  local_6b8._0_8_ = (pointer)0x0;
  local_6b8._8_2_ = 0;
  local_6b8._10_6_ = 0;
  local_6b8._16_2_ = 0;
  local_6b8._18_8_ = 0;
  name._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd02c;
  name._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffd028;
  name._M_string_length = (size_type)in_RDI;
  name.field_2._M_allocated_capacity = in_stack_ffffffffffffd038;
  name.field_2._8_8_ = in_stack_ffffffffffffd040;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffd050;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffd048;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_ffffffffffffd058;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_ffffffffffffd068;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_ffffffffffffd070;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffd078;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffd080;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffd088;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffd090;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffd098;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffd0a0;
  description_21._M_string_length = (size_type)in_stack_ffffffffffffd0b0;
  description_21._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd0a8;
  description_21.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffd0b8;
  description_21.field_2._8_8_ = in_stack_ffffffffffffd0c0;
  opts.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd0d0;
  opts._0_8_ = in_stack_ffffffffffffd0c8;
  opts.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffd0d8;
  opts.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffd0e0;
  opts.oneline_description.field_2._8_8_ = in_stack_ffffffffffffd0e8;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffd0f0;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffd0f8;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffd100;
  opts._64_8_ = in_stack_ffffffffffffd108;
  ::RPCArg::RPCArg(&local_5a0,name,(Type)&local_5c0,fallback,description_21,opts);
  local_700[0] = local_6f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_700,"maxconf","");
  local_2cc0[0] = 9999999;
  ::UniValue::UniValue<int,_int,_true>(&local_7b8,local_2cc0);
  paVar14 = &local_7b8.val.field_2;
  local_760._8_8_ = (long)&local_760 + 0x18;
  local_760._M_first._M_storage =
       (_Uninitialized<RPCArg::Optional,_true>)(_Uninitialized<RPCArg::Optional,_true>)local_7b8.typ
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b8.val._M_dataplus._M_p == paVar14) {
    local_760._32_8_ = local_7b8.val.field_2._8_8_;
  }
  else {
    local_760._8_8_ = local_7b8.val._M_dataplus._M_p;
  }
  local_760._16_8_ = local_7b8.val._M_string_length;
  local_7b8.val._M_string_length = 0;
  local_7b8.val.field_2._M_local_buf[0] = '\0';
  local_760._40_8_ =
       local_7b8.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_760._48_8_ =
       local_7b8.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_760._56_8_ =
       local_7b8.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_7b8.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_7b8.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_7b8.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_760._64_4_ =
       local_7b8.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  local_760._68_4_ =
       local_7b8.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  local_760._72_4_ =
       local_7b8.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._0_4_;
  local_760._76_4_ =
       local_7b8.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._4_4_;
  local_760._80_8_ =
       local_7b8.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_7b8.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_7b8.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_7b8.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_708 = 2;
  local_7d8[0] = local_7c8;
  local_7b8.val._M_dataplus._M_p = (pointer)paVar14;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_7d8,"The maximum confirmations to filter","");
  local_818 = &local_808;
  local_820 = 0;
  local_810 = 0;
  local_808 = 0;
  local_7f8._0_8_ = (pointer)0x0;
  local_7f8._8_2_ = 0;
  local_7f8._10_6_ = 0;
  local_7f8._16_2_ = 0;
  local_7f8._18_8_ = 0;
  name_00._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd02c;
  name_00._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffd028;
  name_00._M_string_length = (size_type)in_RDI;
  name_00.field_2._M_allocated_capacity = in_stack_ffffffffffffd038;
  name_00.field_2._8_8_ = in_stack_ffffffffffffd040;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffd050;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffd048;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_ffffffffffffd058;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_ffffffffffffd068;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_ffffffffffffd070;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffd078;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffd080;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffd088;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffd090;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffd098;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffd0a0;
  description_22._M_string_length = (size_type)in_stack_ffffffffffffd0b0;
  description_22._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd0a8;
  description_22.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffd0b8;
  description_22.field_2._8_8_ = in_stack_ffffffffffffd0c0;
  opts_00.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd0d0;
  opts_00._0_8_ = in_stack_ffffffffffffd0c8;
  opts_00.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffd0d8;
  opts_00.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffd0e0;
  opts_00.oneline_description.field_2._8_8_ = in_stack_ffffffffffffd0e8;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffd0f0;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffd0f8;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffd100;
  opts_00._64_8_ = in_stack_ffffffffffffd108;
  ::RPCArg::RPCArg(&local_498,name_00,(Type)local_700,fallback_00,description_22,opts_00);
  local_840[0] = local_830;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_840,"addresses","");
  local_918 = &local_908;
  local_910 = 0;
  local_8f0 = &local_8e0;
  local_8f8 = 2;
  uStack_8df = uStack_907;
  uStack_8d7 = local_8ff;
  uStack_8d3 = local_8fb;
  uStack_8d1 = local_8f9;
  local_908 = 0;
  local_8a0._8_8_ = (long)&local_8a0 + 0x18;
  local_8a0._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)2;
  local_8a0._24_8_ = (ulong)uStack_907 << 8;
  local_8a0._16_8_ = 0;
  local_8e8 = 0;
  local_8e0 = 0;
  local_8a0._40_8_ = 0;
  local_8a0._48_8_ = 0;
  local_8a0._56_8_ = 0;
  local_8d0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_8d0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_8d0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_8a0._64_4_ = 0;
  local_8a0._68_4_ = 0;
  local_8a0._72_4_ = 0;
  local_8a0._76_4_ = 0;
  local_8a0._80_8_ = 0;
  vStack_8b8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  vStack_8b8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  vStack_8b8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  local_848 = 2;
  local_938[0] = local_928;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_938,"The bitcoin addresses to filter","");
  local_a60[0] = local_a50;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a60,"address","");
  local_ac0._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)OMITTED;
  local_a68 = 0;
  local_ae0[0] = local_ad0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ae0,"bitcoin address","");
  local_b20 = &local_b10;
  local_b28 = 0;
  local_b18 = 0;
  local_b10 = 0;
  local_b00._0_8_ = (pointer)0x0;
  local_b00._8_2_ = 0;
  local_b00._10_6_ = 0;
  local_b00._16_2_ = 0;
  local_b00._18_8_ = 0;
  name_01._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd02c;
  name_01._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffd028;
  name_01._M_string_length = (size_type)in_RDI;
  name_01.field_2._M_allocated_capacity = in_stack_ffffffffffffd038;
  name_01.field_2._8_8_ = in_stack_ffffffffffffd040;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffd050;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffd048;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_ffffffffffffd058;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_ffffffffffffd068;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_ffffffffffffd070;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffd078;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffd080;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffd088;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffd090;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffd098;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffd0a0;
  description_23._M_string_length = (size_type)in_stack_ffffffffffffd0b0;
  description_23._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd0a8;
  description_23.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffd0b8;
  description_23.field_2._8_8_ = in_stack_ffffffffffffd0c0;
  opts_01.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd0d0;
  opts_01._0_8_ = in_stack_ffffffffffffd0c8;
  opts_01.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffd0d8;
  opts_01.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffd0e0;
  opts_01.oneline_description.field_2._8_8_ = in_stack_ffffffffffffd0e8;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffd0f0;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffd0f8;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffd100;
  opts_01._64_8_ = in_stack_ffffffffffffd108;
  ::RPCArg::RPCArg(&local_a40,name_01,(Type)local_a60,fallback_01,description_23,opts_01);
  __l._M_len = 1;
  __l._M_array = &local_a40;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector(&local_2cd8,__l,&local_2cd9);
  local_b68 = &local_b58;
  local_b70[0] = 0;
  local_b60 = 0;
  local_b58 = 0;
  local_b48._0_8_ = (pointer)0x0;
  local_b48._8_2_ = 0;
  local_b48._10_6_ = 0;
  local_b48._16_2_ = 0;
  local_b48._18_8_ = 0;
  puVar19 = local_b70;
  name_02._M_string_length = (size_type)in_RDI;
  name_02._M_dataplus._M_p = puVar19;
  name_02.field_2._M_allocated_capacity = in_stack_ffffffffffffd038;
  name_02.field_2._8_8_ = in_stack_ffffffffffffd040;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffd050;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffd048;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_ffffffffffffd058;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_ffffffffffffd068;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_ffffffffffffd070;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffd078;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffd080;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffd088;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffd090;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffd098;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffd0a0;
  description_24._M_string_length = (size_type)in_stack_ffffffffffffd0b0;
  description_24._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd0a8;
  description_24.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffd0b8;
  description_24.field_2._8_8_ = in_stack_ffffffffffffd0c0;
  inner_20.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)in_stack_ffffffffffffd0d0;
  inner_20.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)in_stack_ffffffffffffd0c8;
  inner_20.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_ffffffffffffd0d8;
  ::RPCArg::RPCArg(&local_390,name_02,(Type)local_840,fallback_02,description_24,inner_20,
                   (RPCArgOptions *)0x1);
  local_b90[0] = local_b80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b90,"include_unsafe","");
  local_2cda = true;
  ::UniValue::UniValue<bool,_bool,_true>(&local_c48,&local_2cda);
  paVar14 = &local_c48.val.field_2;
  local_bf0._8_8_ = (long)&local_bf0 + 0x18;
  local_bf0._M_first._M_storage =
       (_Uninitialized<RPCArg::Optional,_true>)(_Uninitialized<RPCArg::Optional,_true>)local_c48.typ
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c48.val._M_dataplus._M_p == paVar14) {
    local_bf0._32_8_ = local_c48.val.field_2._8_8_;
  }
  else {
    local_bf0._8_8_ = local_c48.val._M_dataplus._M_p;
  }
  local_bf0._16_8_ = local_c48.val._M_string_length;
  local_c48.val._M_string_length = 0;
  local_c48.val.field_2._M_local_buf[0] = '\0';
  local_bf0._40_8_ =
       local_c48.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_bf0._48_8_ =
       local_c48.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_bf0._56_8_ =
       local_c48.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_c48.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c48.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c48.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_bf0._64_4_ =
       local_c48.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  local_bf0._68_4_ =
       local_c48.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  local_bf0._72_4_ =
       local_c48.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._0_4_;
  local_bf0._76_4_ =
       local_c48.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._4_4_;
  local_bf0._80_8_ =
       local_c48.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_c48.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c48.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c48.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b98 = 2;
  local_c68[0] = local_c58;
  local_c48.val._M_dataplus._M_p = (pointer)paVar14;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c68,
             "Include outputs that are not safe to spend\nSee description of \"safe\" attribute below."
             ,"");
  local_ca8 = &local_c98;
  local_cb0 = 0;
  local_ca0 = 0;
  local_c98 = 0;
  local_c88._0_8_ = (pointer)0x0;
  local_c88._8_2_ = 0;
  local_c88._10_6_ = 0;
  local_c88._16_2_ = 0;
  local_c88._18_8_ = 0;
  name_03._M_string_length = (size_type)in_RDI;
  name_03._M_dataplus._M_p = puVar19;
  name_03.field_2._M_allocated_capacity = in_stack_ffffffffffffd038;
  name_03.field_2._8_8_ = in_stack_ffffffffffffd040;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffd050;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffd048;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_ffffffffffffd058;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_ffffffffffffd068;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_ffffffffffffd070;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffd078;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffd080;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffd088;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffd090;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffd098;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffd0a0;
  description_25._M_string_length = (size_type)in_stack_ffffffffffffd0b0;
  description_25._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd0a8;
  description_25.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffd0b8;
  description_25.field_2._8_8_ = in_stack_ffffffffffffd0c0;
  opts_02.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd0d0;
  opts_02._0_8_ = in_stack_ffffffffffffd0c8;
  opts_02.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffd0d8;
  opts_02.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffd0e0;
  opts_02.oneline_description.field_2._8_8_ = in_stack_ffffffffffffd0e8;
  opts_02.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffd0f0;
  opts_02.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffd0f8;
  opts_02.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffd100;
  opts_02._64_8_ = in_stack_ffffffffffffd108;
  ::RPCArg::RPCArg(&local_288,name_03,(Type)local_b90,fallback_03,description_25,opts_02);
  local_cd0[0] = local_cc0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_cd0,"query_options","");
  local_d30._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)OMITTED;
  local_cd8 = 0;
  local_d50[0] = local_d40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d50,"");
  local_1298.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((long)&local_1298.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1298,"minimumAmount","");
  FormatMoney_abi_cxx11_((string *)local_1370,0);
  ::UniValue::
  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            ((UniValue *)local_1350,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1370);
  local_12f8._8_8_ = local_12f8 + 0x18;
  local_12f8._0_4_ = local_1350._0_4_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1350._8_8_ == &local_1338) {
    local_12f8._32_8_ = local_1338._8_8_;
  }
  else {
    local_12f8._8_8_ = local_1350._8_8_;
  }
  local_12f8._16_8_ = local_1350._16_8_;
  local_1350._16_8_ = 0;
  local_1338._M_local_buf[0] = '\0';
  local_12d0[0] =
       (long)local_1328.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_12d0[1] =
       (long)local_1328.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_12d0[2] =
       (long)local_1328.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_1328.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1328.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1328.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_12d0[3] =
       (long)local_1310.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_12d0[4] =
       (long)local_1310.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_finish;
  local_12d0[5] =
       (long)local_1310.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  local_1310.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  local_1310.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  local_1310.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  local_12a0 = '\x02';
  local_1350._8_8_ = &local_1338;
  std::operator+(&local_13b0,"Minimum value of each UTXO in ",&::CURRENCY_UNIT_abi_cxx11_);
  pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&local_13b0,"");
  local_1390 = local_1380;
  psVar1 = (size_type *)(pbVar13->_M_dataplus)._M_p;
  paVar14 = &pbVar13->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1 == paVar14) {
    local_1380[0] = paVar14->_M_allocated_capacity;
    local_1380[1] = *(undefined8 *)((long)&pbVar13->field_2 + 8);
  }
  else {
    local_1380[0] = paVar14->_M_allocated_capacity;
    local_1390 = psVar1;
  }
  local_1388 = pbVar13->_M_string_length;
  (pbVar13->_M_dataplus)._M_p = (pointer)paVar14;
  pbVar13->_M_string_length = 0;
  (pbVar13->field_2)._M_local_buf[0] = '\0';
  local_13f0 = &local_13e0;
  local_13f8 = 0;
  local_13e8 = 0;
  local_13e0 = 0;
  local_13d0._0_8_ = (pointer)0x0;
  local_13d0._8_2_ = 0;
  local_13d0._10_6_ = 0;
  local_13d0._16_2_ = 0;
  local_13d0._18_8_ = 0;
  name_04._M_string_length = (size_type)in_RDI;
  name_04._M_dataplus._M_p = puVar19;
  name_04.field_2._M_allocated_capacity = in_stack_ffffffffffffd038;
  name_04.field_2._8_8_ = in_stack_ffffffffffffd040;
  fallback_04.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffd050;
  fallback_04.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffd048;
  fallback_04.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_ffffffffffffd058;
  fallback_04.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_ffffffffffffd068;
  fallback_04.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_ffffffffffffd070;
  fallback_04.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffd078;
  fallback_04.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffd080;
  fallback_04.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffd088;
  fallback_04.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffd090;
  fallback_04.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffd098;
  fallback_04.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffd0a0;
  description_26._M_string_length = (size_type)in_stack_ffffffffffffd0b0;
  description_26._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd0a8;
  description_26.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffd0b8;
  description_26.field_2._8_8_ = in_stack_ffffffffffffd0c0;
  opts_03.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd0d0;
  opts_03._0_8_ = in_stack_ffffffffffffd0c8;
  opts_03.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffd0d8;
  opts_03.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffd0e0;
  opts_03.oneline_description.field_2._8_8_ = in_stack_ffffffffffffd0e8;
  opts_03.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffd0f0;
  opts_03.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffd0f8;
  opts_03.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffd100;
  opts_03._64_8_ = in_stack_ffffffffffffd108;
  ::RPCArg::RPCArg(&local_1278,name_04,(Type)&local_1298,fallback_04,description_26,opts_03);
  local_1418[0] = local_1408;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1418,"maximumAmount","");
  local_1498 = &local_1488;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1498,"unlimited","");
  local_1478._0_8_ = (long)&local_1478 + 0x10;
  if (local_1498 == &local_1488) {
    local_1478._24_8_ = uStack_1480;
  }
  else {
    local_1478._0_8_ = local_1498;
  }
  local_1478._8_8_ = local_1490;
  local_1490 = 0;
  local_1488 = 0;
  local_1420 = 1;
  local_1498 = &local_1488;
  std::operator+(&local_14d8,"Maximum value of each UTXO in ",&::CURRENCY_UNIT_abi_cxx11_);
  pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&local_14d8,"");
  local_14b8 = &local_14a8;
  psVar1 = (size_type *)(pbVar13->_M_dataplus)._M_p;
  paVar14 = &pbVar13->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1 == paVar14) {
    local_14a8 = paVar14->_M_allocated_capacity;
    uStack_14a0 = *(undefined8 *)((long)&pbVar13->field_2 + 8);
  }
  else {
    local_14a8 = paVar14->_M_allocated_capacity;
    local_14b8 = psVar1;
  }
  local_14b0 = pbVar13->_M_string_length;
  (pbVar13->_M_dataplus)._M_p = (pointer)paVar14;
  pbVar13->_M_string_length = 0;
  (pbVar13->field_2)._M_local_buf[0] = '\0';
  local_1518 = &local_1508;
  local_1520 = 0;
  local_1510 = 0;
  local_1508 = 0;
  local_14f8._0_8_ = (pointer)0x0;
  local_14f8._8_2_ = 0;
  local_14f8._10_6_ = 0;
  local_14f8._16_2_ = 0;
  local_14f8._18_8_ = 0;
  name_05._M_string_length = (size_type)in_RDI;
  name_05._M_dataplus._M_p = puVar19;
  name_05.field_2._M_allocated_capacity = in_stack_ffffffffffffd038;
  name_05.field_2._8_8_ = in_stack_ffffffffffffd040;
  fallback_05.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffd050;
  fallback_05.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffd048;
  fallback_05.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_ffffffffffffd058;
  fallback_05.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_ffffffffffffd068;
  fallback_05.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_ffffffffffffd070;
  fallback_05.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffd078;
  fallback_05.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffd080;
  fallback_05.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffd088;
  fallback_05.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffd090;
  fallback_05.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffd098;
  fallback_05.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffd0a0;
  description_27._M_string_length = (size_type)in_stack_ffffffffffffd0b0;
  description_27._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd0a8;
  description_27.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffd0b8;
  description_27.field_2._8_8_ = in_stack_ffffffffffffd0c0;
  opts_04.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd0d0;
  opts_04._0_8_ = in_stack_ffffffffffffd0c8;
  opts_04.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffd0d8;
  opts_04.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffd0e0;
  opts_04.oneline_description.field_2._8_8_ = in_stack_ffffffffffffd0e8;
  opts_04.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffd0f0;
  opts_04.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffd0f8;
  opts_04.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffd100;
  opts_04._64_8_ = in_stack_ffffffffffffd108;
  ::RPCArg::RPCArg(&local_1170,name_05,(Type)local_1418,fallback_05,description_27,opts_04);
  local_1540[0] = local_1530;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1540,"maximumCount","");
  local_15c0 = &local_15b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_15c0,"unlimited","");
  local_15a0._0_8_ = (long)&local_15a0 + 0x10;
  if (local_15c0 == &local_15b0) {
    local_15a0._24_4_ = uStack_15a8;
    local_15a0._28_4_ = uStack_15a4;
  }
  else {
    local_15a0._0_8_ = local_15c0;
  }
  local_15a0._8_8_ = local_15b8;
  local_15b8 = 0;
  local_15b0 = local_15b0 & 0xffffff00;
  local_1548 = 1;
  local_15e0[0] = local_15d0;
  local_15c0 = &local_15b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_15e0,"Maximum number of UTXOs","")
  ;
  local_1620 = &local_1610;
  local_1628 = 0;
  local_1618 = 0;
  local_1610 = 0;
  local_1600._0_8_ = (pointer)0x0;
  local_1600._8_2_ = 0;
  local_1600._10_6_ = 0;
  local_1600._16_2_ = 0;
  local_1600._18_8_ = 0;
  name_06._M_string_length = (size_type)in_RDI;
  name_06._M_dataplus._M_p = puVar19;
  name_06.field_2._M_allocated_capacity = in_stack_ffffffffffffd038;
  name_06.field_2._8_8_ = in_stack_ffffffffffffd040;
  fallback_06.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffd050;
  fallback_06.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffd048;
  fallback_06.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_ffffffffffffd058;
  fallback_06.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_ffffffffffffd068;
  fallback_06.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_ffffffffffffd070;
  fallback_06.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffd078;
  fallback_06.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffd080;
  fallback_06.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffd088;
  fallback_06.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffd090;
  fallback_06.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffd098;
  fallback_06.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffd0a0;
  description_28._M_string_length = (size_type)in_stack_ffffffffffffd0b0;
  description_28._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd0a8;
  description_28.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffd0b8;
  description_28.field_2._8_8_ = in_stack_ffffffffffffd0c0;
  opts_05.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd0d0;
  opts_05._0_8_ = in_stack_ffffffffffffd0c8;
  opts_05.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffd0d8;
  opts_05.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffd0e0;
  opts_05.oneline_description.field_2._8_8_ = in_stack_ffffffffffffd0e8;
  opts_05.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffd0f0;
  opts_05.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffd0f8;
  opts_05.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffd100;
  opts_05._64_8_ = in_stack_ffffffffffffd108;
  ::RPCArg::RPCArg(&local_1068,name_06,(Type)local_1540,fallback_06,description_28,opts_05);
  local_1648[0] = local_1638;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1648,"minimumSumAmount","");
  local_16c8 = &local_16b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_16c8,"unlimited","");
  local_16a8._0_8_ = (long)&local_16a8 + 0x10;
  if (local_16c8 == &local_16b8) {
    local_16a8._24_8_ = uStack_16b0;
  }
  else {
    local_16a8._0_8_ = local_16c8;
  }
  local_16a8._8_8_ = local_16c0;
  local_16c0 = 0;
  local_16b8 = 0;
  local_1650 = 1;
  local_16c8 = &local_16b8;
  std::operator+(&local_1708,"Minimum sum value of all UTXOs in ",&::CURRENCY_UNIT_abi_cxx11_);
  pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&local_1708,"");
  local_16e8 = &local_16d8;
  psVar1 = (size_type *)(pbVar13->_M_dataplus)._M_p;
  paVar14 = &pbVar13->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1 == paVar14) {
    local_16d8 = paVar14->_M_allocated_capacity;
    uStack_16d0 = *(undefined8 *)((long)&pbVar13->field_2 + 8);
  }
  else {
    local_16d8 = paVar14->_M_allocated_capacity;
    local_16e8 = psVar1;
  }
  local_16e0 = pbVar13->_M_string_length;
  (pbVar13->_M_dataplus)._M_p = (pointer)paVar14;
  pbVar13->_M_string_length = 0;
  (pbVar13->field_2)._M_local_buf[0] = '\0';
  local_1748 = &local_1738;
  local_1750 = 0;
  local_1740 = 0;
  local_1738 = 0;
  local_1728._0_8_ = (pointer)0x0;
  local_1728._8_2_ = 0;
  local_1728._10_6_ = 0;
  local_1728._16_2_ = 0;
  local_1728._18_8_ = 0;
  name_07._M_string_length = (size_type)in_RDI;
  name_07._M_dataplus._M_p = puVar19;
  name_07.field_2._M_allocated_capacity = in_stack_ffffffffffffd038;
  name_07.field_2._8_8_ = in_stack_ffffffffffffd040;
  fallback_07.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffd050;
  fallback_07.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffd048;
  fallback_07.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_ffffffffffffd058;
  fallback_07.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_ffffffffffffd068;
  fallback_07.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_ffffffffffffd070;
  fallback_07.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffd078;
  fallback_07.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffd080;
  fallback_07.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffd088;
  fallback_07.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffd090;
  fallback_07.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffd098;
  fallback_07.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffd0a0;
  description_29._M_string_length = (size_type)in_stack_ffffffffffffd0b0;
  description_29._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd0a8;
  description_29.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffd0b8;
  description_29.field_2._8_8_ = in_stack_ffffffffffffd0c0;
  opts_06.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd0d0;
  opts_06._0_8_ = in_stack_ffffffffffffd0c8;
  opts_06.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffd0d8;
  opts_06.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffd0e0;
  opts_06.oneline_description.field_2._8_8_ = in_stack_ffffffffffffd0e8;
  opts_06.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffd0f0;
  opts_06.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffd0f8;
  opts_06.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffd100;
  opts_06._64_8_ = in_stack_ffffffffffffd108;
  ::RPCArg::RPCArg(&local_f60,name_07,(Type)local_1648,fallback_07,description_29,opts_06);
  local_1770[0] = local_1760;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1770,"include_immature_coinbase","");
  local_2cf9 = false;
  ::UniValue::UniValue<bool,_bool,_true>(&local_1828,&local_2cf9);
  paVar14 = &local_1828.val.field_2;
  local_17d0._8_8_ = (long)&local_17d0 + 0x18;
  local_17d0._M_first._M_storage =
       (_Uninitialized<RPCArg::Optional,_true>)
       (_Uninitialized<RPCArg::Optional,_true>)local_1828.typ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1828.val._M_dataplus._M_p == paVar14) {
    local_17d0._32_8_ = local_1828.val.field_2._8_8_;
  }
  else {
    local_17d0._8_8_ = local_1828.val._M_dataplus._M_p;
  }
  local_17d0._16_8_ = local_1828.val._M_string_length;
  local_1828.val._M_string_length = 0;
  local_1828.val.field_2._M_local_buf[0] = '\0';
  local_17d0._40_8_ =
       local_1828.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_17d0._48_8_ =
       local_1828.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_17d0._56_8_ =
       local_1828.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_1828.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1828.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1828.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_17d0._64_4_ =
       local_1828.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  local_17d0._68_4_ =
       local_1828.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  local_17d0._72_4_ =
       local_1828.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._0_4_;
  local_17d0._76_4_ =
       local_1828.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._4_4_;
  local_17d0._80_8_ =
       local_1828.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_1828.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1828.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1828.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1778 = 2;
  local_1848[0] = local_1838;
  local_1828.val._M_dataplus._M_p = (pointer)paVar14;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1848,"Include immature coinbase UTXOs","");
  local_1888 = &local_1878;
  local_1890 = 0;
  local_1880 = 0;
  local_1878 = 0;
  local_1868._0_8_ = (pointer)0x0;
  local_1868._8_2_ = 0;
  local_1868._10_6_ = 0;
  local_1868._16_2_ = 0;
  local_1868._18_8_ = 0;
  name_08._M_string_length = (size_type)in_RDI;
  name_08._M_dataplus._M_p = puVar19;
  name_08.field_2._M_allocated_capacity = in_stack_ffffffffffffd038;
  name_08.field_2._8_8_ = in_stack_ffffffffffffd040;
  fallback_08.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffd050;
  fallback_08.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffd048;
  fallback_08.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_ffffffffffffd058;
  fallback_08.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_ffffffffffffd068;
  fallback_08.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_ffffffffffffd070;
  fallback_08.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffd078;
  fallback_08.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffd080;
  fallback_08.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffd088;
  fallback_08.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffd090;
  fallback_08.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffd098;
  fallback_08.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffd0a0;
  description_30._M_string_length = (size_type)in_stack_ffffffffffffd0b0;
  description_30._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd0a8;
  description_30.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffd0b8;
  description_30.field_2._8_8_ = in_stack_ffffffffffffd0c0;
  opts_07.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd0d0;
  opts_07._0_8_ = in_stack_ffffffffffffd0c8;
  opts_07.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffd0d8;
  opts_07.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffd0e0;
  opts_07.oneline_description.field_2._8_8_ = in_stack_ffffffffffffd0e8;
  opts_07.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffd0f0;
  opts_07.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffd0f8;
  opts_07.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffd100;
  opts_07._64_8_ = in_stack_ffffffffffffd108;
  ::RPCArg::RPCArg(&local_e58,name_08,(Type)local_1770,fallback_08,description_30,opts_07);
  __l_00._M_len = 5;
  __l_00._M_array = &local_1278;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector(&local_2cf8,__l_00,&local_2cfa);
  local_18d8[0] = 0;
  local_18d0[0] = local_18c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_18d0,"query_options","");
  puVar19 = local_18d8;
  local_18b0._16_2_ = 0;
  local_18b0._18_8_ = 0;
  local_18b0._0_8_ = (pointer)0x0;
  local_18b0._8_2_ = 0;
  local_18b0._10_6_ = 0;
  name_09._M_string_length = (size_type)in_RDI;
  name_09._M_dataplus._M_p = puVar19;
  name_09.field_2._M_allocated_capacity = in_stack_ffffffffffffd038;
  name_09.field_2._8_8_ = in_stack_ffffffffffffd040;
  fallback_09.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffd050;
  fallback_09.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffd048;
  fallback_09.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_ffffffffffffd058;
  fallback_09.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_ffffffffffffd068;
  fallback_09.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_ffffffffffffd070;
  fallback_09.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffd078;
  fallback_09.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffd080;
  fallback_09.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffd088;
  fallback_09.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffd090;
  fallback_09.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffd098;
  fallback_09.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffd0a0;
  description_31._M_string_length = (size_type)in_stack_ffffffffffffd0b0;
  description_31._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd0a8;
  description_31.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffd0b8;
  description_31.field_2._8_8_ = in_stack_ffffffffffffd0c0;
  inner_21.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)in_stack_ffffffffffffd0d0;
  inner_21.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)in_stack_ffffffffffffd0c8;
  inner_21.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_ffffffffffffd0d8;
  ::RPCArg::RPCArg(&local_180,name_09,(Type)local_cd0,fallback_09,description_31,inner_21,
                   (RPCArgOptions *)0x5);
  __l_01._M_len = 5;
  __l_01._M_array = &local_5a0;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector(&local_2cb8,__l_01,&local_2cfb);
  local_1980[0] = local_1970;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1980,"");
  local_19a0[0] = local_1990;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_19a0,"");
  local_1a48[0] = local_1a38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a48,"");
  local_1a68[0] = local_1a58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a68,"");
  local_2418[0] = (pointer)local_2408;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2418,"txid","");
  local_2438[0] = local_2428;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2438,"the transaction id","");
  local_2d68.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2d68.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2d68.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name._M_string_length = (size_type)in_RDI;
  m_key_name._M_dataplus._M_p = puVar19;
  m_key_name.field_2._M_allocated_capacity = in_stack_ffffffffffffd038;
  m_key_name.field_2._8_8_ = in_stack_ffffffffffffd040;
  description._M_string_length = in_stack_ffffffffffffd050;
  description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd048;
  description.field_2 = in_stack_ffffffffffffd058;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = in_stack_ffffffffffffd070;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = in_stack_ffffffffffffd068;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_ffffffffffffd078;
  ::RPCResult::RPCResult
            ((RPCResult *)(local_2408 + 0x10),STR_HEX,m_key_name,description,inner,
             SUB81(local_2418,0));
  local_2458.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_2458.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2458,"vout","");
  local_2478[0] = local_2468;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2478,"the vout value","");
  local_2d88.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2d88.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2d88.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_00._M_string_length = (size_type)in_RDI;
  m_key_name_00._M_dataplus._M_p = puVar19;
  m_key_name_00.field_2._M_allocated_capacity = in_stack_ffffffffffffd038;
  m_key_name_00.field_2._8_8_ = in_stack_ffffffffffffd040;
  description_00._M_string_length = in_stack_ffffffffffffd050;
  description_00._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd048;
  description_00.field_2 = in_stack_ffffffffffffd058;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffd070;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffd068;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd078;
  ::RPCResult::RPCResult(&local_2370,NUM,m_key_name_00,description_00,inner_00,SUB81(&local_2458,0))
  ;
  local_2498[0] = local_2488;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2498,"address","");
  uVar20 = (undefined4)((ulong)puVar19 >> 0x20);
  local_24b8[0] = local_24a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_24b8,"the bitcoin address","");
  local_2da8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2da8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2da8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar3._4_8_ = in_RDI;
  auVar3._0_4_ = uVar20;
  auVar3._12_8_ = in_stack_ffffffffffffd038;
  auVar3._20_8_ = in_stack_ffffffffffffd040;
  auVar3._28_4_ = 0;
  description_01._M_string_length = in_stack_ffffffffffffd050;
  description_01._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd048;
  description_01.field_2 = in_stack_ffffffffffffd058;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffd070;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffd068;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd078;
  ::RPCResult::RPCResult
            (&local_22e8,STR,(string)(auVar3 << 0x20),SUB81(local_2498,0),description_01,inner_01,
             true);
  local_24d8[0] = local_24c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_24d8,"label","");
  local_24f8[0] = local_24e8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_24f8,"The associated label, or \"\" for the default label","");
  local_2dc8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2dc8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2dc8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar18 = 0;
  auVar4._4_8_ = in_RDI;
  auVar4._0_4_ = uVar20;
  auVar4._12_8_ = in_stack_ffffffffffffd038;
  auVar4._20_8_ = in_stack_ffffffffffffd040;
  auVar4._28_4_ = 0;
  description_02._M_string_length = in_stack_ffffffffffffd050;
  description_02._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd048;
  description_02.field_2 = in_stack_ffffffffffffd058;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffd070;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffd068;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd078;
  ::RPCResult::RPCResult
            (&local_2260,STR,(string)(auVar4 << 0x20),SUB81(local_24d8,0),description_02,inner_02,
             true);
  local_2518[0] = local_2508;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2518,"scriptPubKey","");
  local_2538[0] = local_2528;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2538,"the output script","");
  local_2de8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2de8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2de8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_01._M_dataplus._M_p._4_4_ = uVar20;
  m_key_name_01._M_dataplus._M_p._0_4_ = uVar18;
  m_key_name_01._M_string_length = (size_type)in_RDI;
  m_key_name_01.field_2._M_allocated_capacity = in_stack_ffffffffffffd038;
  m_key_name_01.field_2._8_8_ = in_stack_ffffffffffffd040;
  description_03._M_string_length = in_stack_ffffffffffffd050;
  description_03._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd048;
  description_03.field_2 = in_stack_ffffffffffffd058;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffd070;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffd068;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd078;
  ::RPCResult::RPCResult(&local_21d8,STR,m_key_name_01,description_03,inner_03,SUB81(local_2518,0));
  local_2558[0] = local_2548;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2558,"amount","");
  std::operator+(&local_2578,"the transaction output amount in ",&::CURRENCY_UNIT_abi_cxx11_);
  local_2e08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2e08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2e08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_02._M_dataplus._M_p._4_4_ = uVar20;
  m_key_name_02._M_dataplus._M_p._0_4_ = uVar18;
  m_key_name_02._M_string_length = (size_type)in_RDI;
  m_key_name_02.field_2._M_allocated_capacity = in_stack_ffffffffffffd038;
  m_key_name_02.field_2._8_8_ = in_stack_ffffffffffffd040;
  description_04._M_string_length = in_stack_ffffffffffffd050;
  description_04._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd048;
  description_04.field_2 = in_stack_ffffffffffffd058;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffd070;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffd068;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd078;
  ::RPCResult::RPCResult
            (&local_2150,STR_AMOUNT,m_key_name_02,description_04,inner_04,SUB81(local_2558,0));
  local_2598[0] = local_2588;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2598,"confirmations","");
  local_25b8[0] = local_25a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_25b8,"The number of confirmations","");
  local_2e28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2e28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2e28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_03._M_dataplus._M_p._4_4_ = uVar20;
  m_key_name_03._M_dataplus._M_p._0_4_ = uVar18;
  m_key_name_03._M_string_length = (size_type)in_RDI;
  m_key_name_03.field_2._M_allocated_capacity = in_stack_ffffffffffffd038;
  m_key_name_03.field_2._8_8_ = in_stack_ffffffffffffd040;
  description_05._M_string_length = in_stack_ffffffffffffd050;
  description_05._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd048;
  description_05.field_2 = in_stack_ffffffffffffd058;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffd070;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffd068;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd078;
  ::RPCResult::RPCResult(&local_20c8,NUM,m_key_name_03,description_05,inner_05,SUB81(local_2598,0));
  local_25d8[0] = local_25c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_25d8,"ancestorcount","");
  local_25f8[0] = local_25e8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_25f8,
             "The number of in-mempool ancestor transactions, including this one (if transaction is in the mempool)"
             ,"");
  local_2e48.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2e48.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2e48.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar5._4_8_ = in_RDI;
  auVar5._0_4_ = uVar20;
  auVar5._12_8_ = in_stack_ffffffffffffd038;
  auVar5._20_8_ = in_stack_ffffffffffffd040;
  auVar5._28_4_ = 0;
  description_06._M_string_length = in_stack_ffffffffffffd050;
  description_06._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd048;
  description_06.field_2 = in_stack_ffffffffffffd058;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffd070;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffd068;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd078;
  ::RPCResult::RPCResult
            (&local_2040,NUM,(string)(auVar5 << 0x20),SUB81(local_25d8,0),description_06,inner_06,
             true);
  local_2618[0] = local_2608;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2618,"ancestorsize","");
  local_2638[0] = local_2628;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2638,
             "The virtual transaction size of in-mempool ancestors, including this one (if transaction is in the mempool)"
             ,"");
  local_2e68.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2e68.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2e68.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar6._4_8_ = in_RDI;
  auVar6._0_4_ = uVar20;
  auVar6._12_8_ = in_stack_ffffffffffffd038;
  auVar6._20_8_ = in_stack_ffffffffffffd040;
  auVar6._28_4_ = 0;
  description_07._M_string_length = in_stack_ffffffffffffd050;
  description_07._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd048;
  description_07.field_2 = in_stack_ffffffffffffd058;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffd070;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffd068;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd078;
  ::RPCResult::RPCResult
            (&local_1fb8,NUM,(string)(auVar6 << 0x20),SUB81(local_2618,0),description_07,inner_07,
             true);
  local_2658[0] = local_2648;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2658,"ancestorfees","");
  std::operator+(&local_2698,
                 "The total fees of in-mempool ancestors (including this one) with fee deltas used for mining priority in "
                 ,&::CURRENCY_ATOM_abi_cxx11_);
  pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&local_2698," (if transaction is in the mempool)");
  local_2678 = &local_2668;
  psVar1 = (size_type *)(pbVar13->_M_dataplus)._M_p;
  paVar14 = &pbVar13->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1 == paVar14) {
    local_2668 = paVar14->_M_allocated_capacity;
    uStack_2660 = *(undefined8 *)((long)&pbVar13->field_2 + 8);
  }
  else {
    local_2668 = paVar14->_M_allocated_capacity;
    local_2678 = psVar1;
  }
  local_2670 = pbVar13->_M_string_length;
  (pbVar13->_M_dataplus)._M_p = (pointer)paVar14;
  pbVar13->_M_string_length = 0;
  (pbVar13->field_2)._M_local_buf[0] = '\0';
  local_2e88.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2e88.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2e88.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  auVar7._4_8_ = in_RDI;
  auVar7._0_4_ = uVar20;
  auVar7._12_8_ = in_stack_ffffffffffffd038;
  auVar7._20_8_ = in_stack_ffffffffffffd040;
  auVar7._28_4_ = 0;
  description_08._M_string_length = in_stack_ffffffffffffd050;
  description_08._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd048;
  description_08.field_2 = in_stack_ffffffffffffd058;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffd070;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffd068;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd078;
  ::RPCResult::RPCResult
            (&local_1f30,STR_AMOUNT,(string)(auVar7 << 0x20),SUB81(local_2658,0),description_08,
             inner_08,true);
  local_26b8[0] = local_26a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_26b8,"redeemScript","");
  local_26d8[0] = local_26c8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_26d8,"The redeem script if the output script is P2SH","");
  local_2ea8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2ea8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2ea8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar8._4_8_ = in_RDI;
  auVar8._0_4_ = uVar20;
  auVar8._12_8_ = in_stack_ffffffffffffd038;
  auVar8._20_8_ = in_stack_ffffffffffffd040;
  auVar8._28_4_ = 0;
  description_09._M_string_length = in_stack_ffffffffffffd050;
  description_09._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd048;
  description_09.field_2 = in_stack_ffffffffffffd058;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffd070;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffd068;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd078;
  ::RPCResult::RPCResult
            (&local_1ea8,STR_HEX,(string)(auVar8 << 0x20),SUB81(local_26b8,0),description_09,
             inner_09,true);
  local_26f8[0] = local_26e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_26f8,"witnessScript","");
  local_2718[0] = local_2708;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2718,"witness script if the output script is P2WSH or P2SH-P2WSH","");
  local_2ec8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2ec8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2ec8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar18 = 0;
  auVar9._4_8_ = in_RDI;
  auVar9._0_4_ = uVar20;
  auVar9._12_8_ = in_stack_ffffffffffffd038;
  auVar9._20_8_ = in_stack_ffffffffffffd040;
  auVar9._28_4_ = 0;
  description_10._M_string_length = in_stack_ffffffffffffd050;
  description_10._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd048;
  description_10.field_2 = in_stack_ffffffffffffd058;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffd070;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffd068;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd078;
  ::RPCResult::RPCResult
            (&local_1e20,STR,(string)(auVar9 << 0x20),SUB81(local_26f8,0),description_10,inner_10,
             true);
  local_2738[0] = local_2728;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2738,"spendable","");
  local_2758[0] = local_2748;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2758,"Whether we have the private keys to spend this output","");
  local_2ee8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2ee8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2ee8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_04._M_dataplus._M_p._4_4_ = uVar20;
  m_key_name_04._M_dataplus._M_p._0_4_ = uVar18;
  m_key_name_04._M_string_length = (size_type)in_RDI;
  m_key_name_04.field_2._M_allocated_capacity = in_stack_ffffffffffffd038;
  m_key_name_04.field_2._8_8_ = in_stack_ffffffffffffd040;
  description_11._M_string_length = in_stack_ffffffffffffd050;
  description_11._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd048;
  description_11.field_2 = in_stack_ffffffffffffd058;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffd070;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffd068;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd078;
  ::RPCResult::RPCResult(&local_1d98,BOOL,m_key_name_04,description_11,inner_11,SUB81(local_2738,0))
  ;
  local_2778[0] = local_2768;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2778,"solvable","");
  local_2798[0] = local_2788;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2798,
             "Whether we know how to spend this output, ignoring the lack of keys","");
  m_key_name_05._M_dataplus._M_p._4_4_ = uVar20;
  m_key_name_05._M_dataplus._M_p._0_4_ = uVar18;
  m_key_name_05._M_string_length = (size_type)in_RDI;
  m_key_name_05.field_2._M_allocated_capacity = in_stack_ffffffffffffd038;
  m_key_name_05.field_2._8_8_ = in_stack_ffffffffffffd040;
  description_12._M_string_length = in_stack_ffffffffffffd050;
  description_12._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd048;
  description_12.field_2 = in_stack_ffffffffffffd058;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffd070;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffd068;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd078;
  ::RPCResult::RPCResult(&local_1d10,BOOL,m_key_name_05,description_12,inner_12,SUB81(local_2778,0))
  ;
  local_27b8[0] = local_27a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_27b8,"reused","");
  local_27d8[0] = local_27c8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_27d8,
             "(only present if avoid_reuse is set) Whether this output is reused/dirty (sent to an address that was previously spent from)"
             ,"");
  auVar10._4_8_ = in_RDI;
  auVar10._0_4_ = uVar20;
  auVar10._12_8_ = in_stack_ffffffffffffd038;
  auVar10._20_8_ = in_stack_ffffffffffffd040;
  auVar10._28_4_ = 0;
  description_13._M_string_length = in_stack_ffffffffffffd050;
  description_13._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd048;
  description_13.field_2 = in_stack_ffffffffffffd058;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffd070;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffd068;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd078;
  ::RPCResult::RPCResult
            (&local_1c88,BOOL,(string)(auVar10 << 0x20),SUB81(local_27b8,0),description_13,inner_13,
             true);
  local_27f8[0] = local_27e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_27f8,"desc","");
  local_2818[0] = local_2808;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2818,"(only when solvable) A descriptor for spending this output","");
  uVar18 = 0;
  auVar11._4_8_ = in_RDI;
  auVar11._0_4_ = uVar20;
  auVar11._12_8_ = in_stack_ffffffffffffd038;
  auVar11._20_8_ = in_stack_ffffffffffffd040;
  auVar11._28_4_ = 0;
  description_14._M_string_length = in_stack_ffffffffffffd050;
  description_14._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd048;
  description_14.field_2 = in_stack_ffffffffffffd058;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffd070;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffd068;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd078;
  ::RPCResult::RPCResult
            (&local_1c00,STR,(string)(auVar11 << 0x20),SUB81(local_27f8,0),description_14,inner_14,
             true);
  local_2838[0] = local_2828;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2838,"parent_descs","");
  local_2858[0] = local_2848;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2858,"List of parent descriptors for the output script of this coin.",
             "");
  local_2900[0] = local_28f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2900,"desc","");
  local_2920[0] = local_2910;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2920,"The descriptor string.","");
  pRVar25 = (pointer)0x0;
  pRVar26 = (pointer)0x0;
  pRVar27 = (pointer)0x0;
  m_key_name_06._M_dataplus._M_p._4_4_ = uVar20;
  m_key_name_06._M_dataplus._M_p._0_4_ = uVar18;
  m_key_name_06._M_string_length = (size_type)in_RDI;
  m_key_name_06.field_2._M_allocated_capacity = in_stack_ffffffffffffd038;
  m_key_name_06.field_2._8_8_ = in_stack_ffffffffffffd040;
  description_15._M_string_length = in_stack_ffffffffffffd050;
  description_15._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd048;
  description_15.field_2 = in_stack_ffffffffffffd058;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffd070;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffd068;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd078;
  ::RPCResult::RPCResult(&local_28e0,STR,m_key_name_06,description_15,inner_15,false);
  __l_02._M_len = 1;
  __l_02._M_array = &local_28e0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffd0a0,__l_02,
             (allocator_type *)&stack0xffffffffffffd087);
  uVar18 = 0;
  auVar12._4_8_ = in_RDI;
  auVar12._0_4_ = uVar20;
  auVar12._12_8_ = in_stack_ffffffffffffd038;
  auVar12._20_8_ = in_stack_ffffffffffffd040;
  auVar12._28_4_ = 0;
  description_16._M_string_length = in_stack_ffffffffffffd050;
  description_16._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd048;
  description_16.field_2 = in_stack_ffffffffffffd058;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffd070;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffd068;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd078;
  ::RPCResult::RPCResult
            (&local_1b78,ARR,(string)(auVar12 << 0x20),SUB81(local_2838,0),description_16,inner_16,
             false);
  local_2940[0] = local_2930;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2940,"safe","");
  local_2960[0] = local_2950;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2960,
             "Whether this output is considered safe to spend. Unconfirmed transactions\nfrom outside keys and unconfirmed replacement transactions are considered unsafe\nand are not eligible for spending by fundrawtransaction and sendtoaddress."
             ,"");
  pRVar22 = (pointer)0x0;
  pRVar23 = (pointer)0x0;
  pRVar24 = (pointer)0x0;
  m_key_name_07._M_dataplus._M_p._4_4_ = uVar20;
  m_key_name_07._M_dataplus._M_p._0_4_ = uVar18;
  m_key_name_07._M_string_length = (size_type)in_RDI;
  m_key_name_07.field_2._M_allocated_capacity = in_stack_ffffffffffffd038;
  m_key_name_07.field_2._8_8_ = in_stack_ffffffffffffd040;
  description_17._M_string_length = in_stack_ffffffffffffd050;
  description_17._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd048;
  description_17.field_2._M_local_buf = in_stack_ffffffffffffd058._M_local_buf;
  inner_17.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  inner_17.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  inner_17.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  ::RPCResult::RPCResult(&local_1af0,BOOL,m_key_name_07,description_17,inner_17,SUB81(local_2940,0))
  ;
  __l_03._M_len = 0x12;
  __l_03._M_array = (iterator)(local_2408 + 0x10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_2d48,__l_03,(allocator_type *)&stack0xffffffffffffd067);
  m_key_name_08._M_dataplus._M_p._4_4_ = uVar20;
  m_key_name_08._M_dataplus._M_p._0_4_ = uVar18;
  m_key_name_08._M_string_length = (size_type)in_RDI;
  m_key_name_08.field_2._M_allocated_capacity = in_stack_ffffffffffffd038;
  m_key_name_08.field_2._8_8_ = in_stack_ffffffffffffd040;
  description_18._M_string_length = in_stack_ffffffffffffd050;
  description_18._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd048;
  description_18.field_2._M_local_buf = in_stack_ffffffffffffd058._M_local_buf;
  inner_18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar23;
  inner_18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar22;
  inner_18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar24;
  ::RPCResult::RPCResult(&local_1a28,OBJ,m_key_name_08,description_18,inner_18,SUB81(local_1a48,0));
  __l_04._M_len = 1;
  __l_04._M_array = &local_1a28;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_2d30,__l_04,(allocator_type *)&stack0xffffffffffffd066);
  m_key_name_09._M_dataplus._M_p._4_4_ = uVar20;
  m_key_name_09._M_dataplus._M_p._0_4_ = uVar18;
  m_key_name_09._M_string_length = (size_type)in_RDI;
  m_key_name_09.field_2._M_allocated_capacity = in_stack_ffffffffffffd038;
  m_key_name_09.field_2._8_8_ = in_stack_ffffffffffffd040;
  description_19._M_string_length = in_stack_ffffffffffffd050;
  description_19._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd048;
  description_19.field_2 = in_stack_ffffffffffffd058;
  inner_19.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar23;
  inner_19.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar22;
  inner_19.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar24;
  ::RPCResult::RPCResult(&local_1960,ARR,m_key_name_09,description_19,inner_19,SUB81(local_1980,0));
  result._4_4_ = uVar20;
  result.m_type = uVar18;
  result.m_key_name._M_dataplus._M_p = (pointer)in_RDI;
  result.m_key_name._M_string_length = in_stack_ffffffffffffd038;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_ffffffffffffd040;
  result.m_key_name.field_2._8_8_ = in_stack_ffffffffffffd048;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffd050;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._8_16_ = in_stack_ffffffffffffd058;
  result._64_8_ = pRVar22;
  result.m_description._M_dataplus._M_p = (pointer)pRVar23;
  result.m_description._M_string_length = (size_type)pRVar24;
  result.m_description.field_2._M_allocated_capacity = in_stack_ffffffffffffd080;
  result.m_description.field_2._8_8_ = pRVar25;
  result.m_cond._M_dataplus._M_p = (pointer)pRVar26;
  result.m_cond._M_string_length = (size_type)pRVar27;
  result.m_cond.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffd0a0;
  result.m_cond.field_2._8_8_ = in_stack_ffffffffffffd0a8;
  RPCResults::RPCResults(&local_2d18,result);
  local_2a40._M_dataplus._M_p = (pointer)&local_2a40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a40,"listunspent","");
  local_2a60._M_dataplus._M_p = (pointer)&local_2a60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a60,"");
  HelpExampleCli(&local_2a20,&local_2a40,&local_2a60);
  local_2aa0._M_dataplus._M_p = (pointer)&local_2aa0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2aa0,"listunspent","");
  std::operator+(&local_2b20,"6 9999999 \"[\\\"",EXAMPLE_ADDRESS_abi_cxx11_);
  pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&local_2b20,"\\\",\\\"");
  local_2b00._M_dataplus._M_p = (pointer)&local_2b00.field_2;
  paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar13->_M_dataplus)._M_p;
  paVar15 = &pbVar13->field_2;
  if (paVar14 == paVar15) {
    local_2b00.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
    local_2b00.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
  }
  else {
    local_2b00.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
    local_2b00._M_dataplus._M_p = (pointer)paVar14;
  }
  local_2b00._M_string_length = pbVar13->_M_string_length;
  (pbVar13->_M_dataplus)._M_p = (pointer)paVar15;
  pbVar13->_M_string_length = 0;
  (pbVar13->field_2)._M_local_buf[0] = '\0';
  pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_append(&local_2b00,EXAMPLE_ADDRESS_abi_cxx11_[1]._M_dataplus._M_p,
                      EXAMPLE_ADDRESS_abi_cxx11_[1]._M_string_length);
  local_2ae0._M_dataplus._M_p = (pointer)&local_2ae0.field_2;
  paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar13->_M_dataplus)._M_p;
  paVar15 = &pbVar13->field_2;
  if (paVar14 == paVar15) {
    local_2ae0.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
    local_2ae0.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
  }
  else {
    local_2ae0.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
    local_2ae0._M_dataplus._M_p = (pointer)paVar14;
  }
  local_2ae0._M_string_length = pbVar13->_M_string_length;
  (pbVar13->_M_dataplus)._M_p = (pointer)paVar15;
  pbVar13->_M_string_length = 0;
  (pbVar13->field_2)._M_local_buf[0] = '\0';
  pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&local_2ae0,"\\\"]\"");
  local_2ac0._M_dataplus._M_p = (pointer)&local_2ac0.field_2;
  paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar13->_M_dataplus)._M_p;
  paVar15 = &pbVar13->field_2;
  if (paVar14 == paVar15) {
    local_2ac0.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
    local_2ac0.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
  }
  else {
    local_2ac0.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
    local_2ac0._M_dataplus._M_p = (pointer)paVar14;
  }
  local_2ac0._M_string_length = pbVar13->_M_string_length;
  (pbVar13->_M_dataplus)._M_p = (pointer)paVar15;
  pbVar13->_M_string_length = 0;
  (pbVar13->field_2)._M_local_buf[0] = '\0';
  HelpExampleCli(&local_2a80,&local_2aa0,&local_2ac0);
  uVar16 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a20._M_dataplus._M_p != &local_2a20.field_2) {
    uVar16 = local_2a20.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar16 < local_2a80._M_string_length + local_2a20._M_string_length) {
    uVar16 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a80._M_dataplus._M_p != &local_2a80.field_2) {
      uVar16 = local_2a80.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar16 < local_2a80._M_string_length + local_2a20._M_string_length)
    goto LAB_00cbf488;
    pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              replace(&local_2a80,0,0,local_2a20._M_dataplus._M_p,local_2a20._M_string_length);
  }
  else {
LAB_00cbf488:
    pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_append(&local_2a20,local_2a80._M_dataplus._M_p,local_2a80._M_string_length);
  }
  local_2a00._M_dataplus._M_p = (pointer)&local_2a00.field_2;
  paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar13->_M_dataplus)._M_p;
  paVar14 = &pbVar13->field_2;
  if (paVar15 == paVar14) {
    local_2a00.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
    local_2a00.field_2._8_4_ = *(undefined4 *)((long)&pbVar13->field_2 + 8);
    local_2a00.field_2._12_4_ = *(undefined4 *)((long)&pbVar13->field_2 + 0xc);
  }
  else {
    local_2a00.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
    local_2a00._M_dataplus._M_p = (pointer)paVar15;
  }
  local_2a00._M_string_length = pbVar13->_M_string_length;
  (pbVar13->_M_dataplus)._M_p = (pointer)paVar14;
  pbVar13->_M_string_length = 0;
  paVar14->_M_local_buf[0] = '\0';
  local_2b60._M_dataplus._M_p = (pointer)&local_2b60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b60,"listunspent","");
  std::operator+(&local_2be0,"6, 9999999 \"[\\\"",EXAMPLE_ADDRESS_abi_cxx11_);
  pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&local_2be0,"\\\",\\\"");
  local_2bc0._M_dataplus._M_p = (pointer)&local_2bc0.field_2;
  paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar13->_M_dataplus)._M_p;
  paVar15 = &pbVar13->field_2;
  if (paVar14 == paVar15) {
    local_2bc0.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
    local_2bc0.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
  }
  else {
    local_2bc0.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
    local_2bc0._M_dataplus._M_p = (pointer)paVar14;
  }
  local_2bc0._M_string_length = pbVar13->_M_string_length;
  (pbVar13->_M_dataplus)._M_p = (pointer)paVar15;
  pbVar13->_M_string_length = 0;
  (pbVar13->field_2)._M_local_buf[0] = '\0';
  pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_append(&local_2bc0,EXAMPLE_ADDRESS_abi_cxx11_[1]._M_dataplus._M_p,
                      EXAMPLE_ADDRESS_abi_cxx11_[1]._M_string_length);
  local_2ba0._M_dataplus._M_p = (pointer)&local_2ba0.field_2;
  paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar13->_M_dataplus)._M_p;
  paVar15 = &pbVar13->field_2;
  if (paVar14 == paVar15) {
    local_2ba0.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
    local_2ba0.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
  }
  else {
    local_2ba0.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
    local_2ba0._M_dataplus._M_p = (pointer)paVar14;
  }
  local_2ba0._M_string_length = pbVar13->_M_string_length;
  (pbVar13->_M_dataplus)._M_p = (pointer)paVar15;
  pbVar13->_M_string_length = 0;
  (pbVar13->field_2)._M_local_buf[0] = '\0';
  pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&local_2ba0,"\\\"]\"");
  local_2b80._M_dataplus._M_p = (pointer)&local_2b80.field_2;
  paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar13->_M_dataplus)._M_p;
  paVar15 = &pbVar13->field_2;
  if (paVar14 == paVar15) {
    local_2b80.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
    local_2b80.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
  }
  else {
    local_2b80.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
    local_2b80._M_dataplus._M_p = (pointer)paVar14;
  }
  local_2b80._M_string_length = pbVar13->_M_string_length;
  (pbVar13->_M_dataplus)._M_p = (pointer)paVar15;
  pbVar13->_M_string_length = 0;
  (pbVar13->field_2)._M_local_buf[0] = '\0';
  HelpExampleRpc(&local_2b40,&local_2b60,&local_2b80);
  uVar16 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a00._M_dataplus._M_p != &local_2a00.field_2) {
    uVar16 = local_2a00.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar16 < local_2b40._M_string_length + local_2a00._M_string_length) {
    uVar16 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b40._M_dataplus._M_p != &local_2b40.field_2) {
      uVar16 = local_2b40.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar16 < local_2b40._M_string_length + local_2a00._M_string_length)
    goto LAB_00cbf6dc;
    pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              replace(&local_2b40,0,0,local_2a00._M_dataplus._M_p,local_2a00._M_string_length);
  }
  else {
LAB_00cbf6dc:
    pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_append(&local_2a00,local_2b40._M_dataplus._M_p,local_2b40._M_string_length);
  }
  local_29e0._M_dataplus._M_p = (pointer)&local_29e0.field_2;
  paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar13->_M_dataplus)._M_p;
  paVar14 = &pbVar13->field_2;
  if (paVar15 == paVar14) {
    local_29e0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
    local_29e0.field_2._8_4_ = *(undefined4 *)((long)&pbVar13->field_2 + 8);
    local_29e0.field_2._12_4_ = *(undefined4 *)((long)&pbVar13->field_2 + 0xc);
  }
  else {
    local_29e0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
    local_29e0._M_dataplus._M_p = (pointer)paVar15;
  }
  local_29e0._M_string_length = pbVar13->_M_string_length;
  (pbVar13->_M_dataplus)._M_p = (pointer)paVar14;
  pbVar13->_M_string_length = 0;
  paVar14->_M_local_buf[0] = '\0';
  local_2c20._M_dataplus._M_p = (pointer)&local_2c20.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c20,"listunspent","");
  local_2c40._M_dataplus._M_p = (pointer)&local_2c40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2c40,"6 9999999 \'[]\' true \'{ \"minimumAmount\": 0.005 }\'","");
  HelpExampleCli(&local_2c00,&local_2c20,&local_2c40);
  uVar16 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_29e0._M_dataplus._M_p != &local_29e0.field_2) {
    uVar16 = local_29e0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar16 < local_2c00._M_string_length + local_29e0._M_string_length) {
    uVar16 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c00._M_dataplus._M_p != &local_2c00.field_2) {
      uVar16 = local_2c00.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar16 < local_2c00._M_string_length + local_29e0._M_string_length)
    goto LAB_00cbf815;
    pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              replace(&local_2c00,0,0,local_29e0._M_dataplus._M_p,local_29e0._M_string_length);
  }
  else {
LAB_00cbf815:
    pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_append(&local_29e0,local_2c00._M_dataplus._M_p,local_2c00._M_string_length);
  }
  local_29c0._M_dataplus._M_p = (pointer)&local_29c0.field_2;
  paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar13->_M_dataplus)._M_p;
  paVar14 = &pbVar13->field_2;
  if (paVar15 == paVar14) {
    local_29c0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
    local_29c0.field_2._8_4_ = *(undefined4 *)((long)&pbVar13->field_2 + 8);
    local_29c0.field_2._12_4_ = *(undefined4 *)((long)&pbVar13->field_2 + 0xc);
  }
  else {
    local_29c0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
    local_29c0._M_dataplus._M_p = (pointer)paVar15;
  }
  local_29c0._M_string_length = pbVar13->_M_string_length;
  (pbVar13->_M_dataplus)._M_p = (pointer)paVar14;
  pbVar13->_M_string_length = 0;
  paVar14->_M_local_buf[0] = '\0';
  local_2c80._M_dataplus._M_p = (pointer)&local_2c80.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c80,"listunspent","");
  local_2ca0._M_dataplus._M_p = (pointer)&local_2ca0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2ca0,"6, 9999999, [] , true, { \"minimumAmount\": 0.005 } ","");
  HelpExampleRpc(&local_2c60,&local_2c80,&local_2ca0);
  uVar16 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_29c0._M_dataplus._M_p != &local_29c0.field_2) {
    uVar16 = local_29c0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar16 < local_2c60._M_string_length + local_29c0._M_string_length) {
    uVar16 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c60._M_dataplus._M_p != &local_2c60.field_2) {
      uVar16 = local_2c60.field_2._M_allocated_capacity;
    }
    if (local_2c60._M_string_length + local_29c0._M_string_length <= (ulong)uVar16) {
      pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                replace(&local_2c60,0,0,local_29c0._M_dataplus._M_p,local_29c0._M_string_length);
      goto LAB_00cbf976;
    }
  }
  pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_append(&local_29c0,local_2c60._M_dataplus._M_p,local_2c60._M_string_length);
LAB_00cbf976:
  local_29a0 = &local_2990;
  puVar2 = (ulong *)(pbVar13->_M_dataplus)._M_p;
  paVar14 = &pbVar13->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2 == paVar14) {
    local_2990 = paVar14->_M_allocated_capacity;
    uStack_2988 = *(undefined8 *)((long)&pbVar13->field_2 + 8);
  }
  else {
    local_2990 = paVar14->_M_allocated_capacity;
    local_29a0 = puVar2;
  }
  local_2978 = pbVar13->_M_string_length;
  (pbVar13->_M_dataplus)._M_p = (pointer)paVar14;
  pbVar13->_M_string_length = 0;
  paVar14->_M_local_buf[0] = '\0';
  if (local_29a0 == &local_2990) {
    uStack_2968 = uStack_2988;
    local_2980 = &local_2970;
  }
  else {
    local_2980 = local_29a0;
  }
  local_2970 = local_2990;
  local_2998 = 0;
  local_2990 = local_2990 & 0xffffffffffffff00;
  pcVar21 = std::
            _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/rpc/coins.cpp:561:9)>
            ::_M_manager;
  description_20._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/rpc/coins.cpp:561:9)>
       ::_M_invoke;
  description_20._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/rpc/coins.cpp:561:9)>
                ::_M_manager;
  description_20.field_2 = in_stack_ffffffffffffd058;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)pRVar23;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)pRVar22;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar24;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar25;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffd080;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pRVar26;
  examples.m_examples._M_string_length = (size_type)in_stack_ffffffffffffd0a0;
  examples.m_examples._M_dataplus._M_p = (pointer)pRVar27;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffd0a8;
  examples.m_examples.field_2._8_8_ = in_stack_ffffffffffffd0b0;
  local_29a0 = &local_2990;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_RDI,&stack0xffffffffffffd038)),description_20,args,
             results,examples,(RPCMethodImpl *)&local_58);
  if (pcVar21 != (code *)0x0) {
    (*pcVar21)(&stack0xffffffffffffd038,&stack0xffffffffffffd038,3);
  }
  if (local_2980 != &local_2970) {
    operator_delete(local_2980,local_2970 + 1);
  }
  if (local_29a0 != &local_2990) {
    operator_delete(local_29a0,local_2990 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c60._M_dataplus._M_p != &local_2c60.field_2) {
    operator_delete(local_2c60._M_dataplus._M_p,local_2c60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2ca0._M_dataplus._M_p != &local_2ca0.field_2) {
    operator_delete(local_2ca0._M_dataplus._M_p,local_2ca0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c80._M_dataplus._M_p != &local_2c80.field_2) {
    operator_delete(local_2c80._M_dataplus._M_p,local_2c80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_29c0._M_dataplus._M_p != &local_29c0.field_2) {
    operator_delete(local_29c0._M_dataplus._M_p,local_29c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c00._M_dataplus._M_p != &local_2c00.field_2) {
    operator_delete(local_2c00._M_dataplus._M_p,local_2c00.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c40._M_dataplus._M_p != &local_2c40.field_2) {
    operator_delete(local_2c40._M_dataplus._M_p,local_2c40.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c20._M_dataplus._M_p != &local_2c20.field_2) {
    operator_delete(local_2c20._M_dataplus._M_p,local_2c20.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_29e0._M_dataplus._M_p != &local_29e0.field_2) {
    operator_delete(local_29e0._M_dataplus._M_p,local_29e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b40._M_dataplus._M_p != &local_2b40.field_2) {
    operator_delete(local_2b40._M_dataplus._M_p,local_2b40.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b80._M_dataplus._M_p != &local_2b80.field_2) {
    operator_delete(local_2b80._M_dataplus._M_p,local_2b80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2ba0._M_dataplus._M_p != &local_2ba0.field_2) {
    operator_delete(local_2ba0._M_dataplus._M_p,local_2ba0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2bc0._M_dataplus._M_p != &local_2bc0.field_2) {
    operator_delete(local_2bc0._M_dataplus._M_p,local_2bc0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2be0._M_dataplus._M_p != &local_2be0.field_2) {
    operator_delete(local_2be0._M_dataplus._M_p,local_2be0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b60._M_dataplus._M_p != &local_2b60.field_2) {
    operator_delete(local_2b60._M_dataplus._M_p,local_2b60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a00._M_dataplus._M_p != &local_2a00.field_2) {
    operator_delete(local_2a00._M_dataplus._M_p,local_2a00.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a80._M_dataplus._M_p != &local_2a80.field_2) {
    operator_delete(local_2a80._M_dataplus._M_p,local_2a80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2ac0._M_dataplus._M_p != &local_2ac0.field_2) {
    operator_delete(local_2ac0._M_dataplus._M_p,local_2ac0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2ae0._M_dataplus._M_p != &local_2ae0.field_2) {
    operator_delete(local_2ae0._M_dataplus._M_p,local_2ae0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b00._M_dataplus._M_p != &local_2b00.field_2) {
    operator_delete(local_2b00._M_dataplus._M_p,local_2b00.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b20._M_dataplus._M_p != &local_2b20.field_2) {
    operator_delete(local_2b20._M_dataplus._M_p,local_2b20.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2aa0._M_dataplus._M_p != &local_2aa0.field_2) {
    operator_delete(local_2aa0._M_dataplus._M_p,local_2aa0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a20._M_dataplus._M_p != &local_2a20.field_2) {
    operator_delete(local_2a20._M_dataplus._M_p,local_2a20.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a60._M_dataplus._M_p != &local_2a60.field_2) {
    operator_delete(local_2a60._M_dataplus._M_p,local_2a60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a40._M_dataplus._M_p != &local_2a40.field_2) {
    operator_delete(local_2a40._M_dataplus._M_p,local_2a40.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2d18.m_results);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1960.m_cond._M_dataplus._M_p != &local_1960.m_cond.field_2) {
    operator_delete(local_1960.m_cond._M_dataplus._M_p,
                    local_1960.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1960.m_description._M_dataplus._M_p != &local_1960.m_description.field_2) {
    operator_delete(local_1960.m_description._M_dataplus._M_p,
                    local_1960.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1960.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1960.m_key_name._M_dataplus._M_p != &local_1960.m_key_name.field_2) {
    operator_delete(local_1960.m_key_name._M_dataplus._M_p,
                    local_1960.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2d30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a28.m_cond._M_dataplus._M_p != &local_1a28.m_cond.field_2) {
    operator_delete(local_1a28.m_cond._M_dataplus._M_p,
                    local_1a28.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a28.m_description._M_dataplus._M_p != &local_1a28.m_description.field_2) {
    operator_delete(local_1a28.m_description._M_dataplus._M_p,
                    local_1a28.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1a28.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a28.m_key_name._M_dataplus._M_p != &local_1a28.m_key_name.field_2) {
    operator_delete(local_1a28.m_key_name._M_dataplus._M_p,
                    local_1a28.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2d48);
  lVar17 = 0x990;
  do {
    if ((long *)(local_2408 + lVar17) != *(long **)((long)local_2418 + lVar17)) {
      operator_delete(*(long **)((long)local_2418 + lVar17),*(long *)(local_2408 + lVar17) + 1);
    }
    if ((long *)((long)local_2428 + lVar17) != *(long **)((long)local_2438 + lVar17)) {
      operator_delete(*(long **)((long)local_2438 + lVar17),*(long *)((long)local_2428 + lVar17) + 1
                     );
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_2458.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
               + lVar17));
    if ((long *)((long)local_2468 + lVar17) != *(long **)((long)local_2478 + lVar17)) {
      operator_delete(*(long **)((long)local_2478 + lVar17),*(long *)((long)local_2468 + lVar17) + 1
                     );
    }
    lVar17 = lVar17 + -0x88;
  } while (lVar17 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffd068);
  if (local_2960[0] != local_2950) {
    operator_delete(local_2960[0],local_2950[0] + 1);
  }
  if (local_2940[0] != local_2930) {
    operator_delete(local_2940[0],local_2930[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffd0a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28e0.m_cond._M_dataplus._M_p != &local_28e0.m_cond.field_2) {
    operator_delete(local_28e0.m_cond._M_dataplus._M_p,
                    local_28e0.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28e0.m_description._M_dataplus._M_p != &local_28e0.m_description.field_2) {
    operator_delete(local_28e0.m_description._M_dataplus._M_p,
                    local_28e0.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_28e0.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28e0.m_key_name._M_dataplus._M_p != &local_28e0.m_key_name.field_2) {
    operator_delete(local_28e0.m_key_name._M_dataplus._M_p,
                    local_28e0.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffd088);
  if (local_2920[0] != local_2910) {
    operator_delete(local_2920[0],local_2910[0] + 1);
  }
  if (local_2900[0] != local_28f0) {
    operator_delete(local_2900[0],local_28f0[0] + 1);
  }
  if (local_2858[0] != local_2848) {
    operator_delete(local_2858[0],local_2848[0] + 1);
  }
  if (local_2838[0] != local_2828) {
    operator_delete(local_2838[0],local_2828[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffd0b8);
  if (local_2818[0] != local_2808) {
    operator_delete(local_2818[0],local_2808[0] + 1);
  }
  if (local_27f8[0] != local_27e8) {
    operator_delete(local_27f8[0],local_27e8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffd0d8);
  if (local_27d8[0] != local_27c8) {
    operator_delete(local_27d8[0],local_27c8[0] + 1);
  }
  if (local_27b8[0] != local_27a8) {
    operator_delete(local_27b8[0],local_27a8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffd0f8);
  if (local_2798[0] != local_2788) {
    operator_delete(local_2798[0],local_2788[0] + 1);
  }
  if (local_2778[0] != local_2768) {
    operator_delete(local_2778[0],local_2768[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2ee8);
  if (local_2758[0] != local_2748) {
    operator_delete(local_2758[0],local_2748[0] + 1);
  }
  if (local_2738[0] != local_2728) {
    operator_delete(local_2738[0],local_2728[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2ec8);
  if (local_2718[0] != local_2708) {
    operator_delete(local_2718[0],local_2708[0] + 1);
  }
  if (local_26f8[0] != local_26e8) {
    operator_delete(local_26f8[0],local_26e8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2ea8);
  if (local_26d8[0] != local_26c8) {
    operator_delete(local_26d8[0],local_26c8[0] + 1);
  }
  if (local_26b8[0] != local_26a8) {
    operator_delete(local_26b8[0],local_26a8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2e88);
  if (local_2678 != &local_2668) {
    operator_delete(local_2678,local_2668 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2698._M_dataplus._M_p != &local_2698.field_2) {
    operator_delete(local_2698._M_dataplus._M_p,local_2698.field_2._M_allocated_capacity + 1);
  }
  if (local_2658[0] != local_2648) {
    operator_delete(local_2658[0],local_2648[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2e68);
  if (local_2638[0] != local_2628) {
    operator_delete(local_2638[0],local_2628[0] + 1);
  }
  if (local_2618[0] != local_2608) {
    operator_delete(local_2618[0],local_2608[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2e48);
  if (local_25f8[0] != local_25e8) {
    operator_delete(local_25f8[0],local_25e8[0] + 1);
  }
  if (local_25d8[0] != local_25c8) {
    operator_delete(local_25d8[0],local_25c8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2e28);
  if (local_25b8[0] != local_25a8) {
    operator_delete(local_25b8[0],local_25a8[0] + 1);
  }
  if (local_2598[0] != local_2588) {
    operator_delete(local_2598[0],local_2588[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2e08);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2578._M_dataplus._M_p != &local_2578.field_2) {
    operator_delete(local_2578._M_dataplus._M_p,local_2578.field_2._M_allocated_capacity + 1);
  }
  if (local_2558[0] != local_2548) {
    operator_delete(local_2558[0],local_2548[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2de8);
  if (local_2538[0] != local_2528) {
    operator_delete(local_2538[0],local_2528[0] + 1);
  }
  if (local_2518[0] != local_2508) {
    operator_delete(local_2518[0],local_2508[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2dc8);
  if (local_24f8[0] != local_24e8) {
    operator_delete(local_24f8[0],local_24e8[0] + 1);
  }
  if (local_24d8[0] != local_24c8) {
    operator_delete(local_24d8[0],local_24c8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2da8);
  if (local_24b8[0] != local_24a8) {
    operator_delete(local_24b8[0],local_24a8[0] + 1);
  }
  if (local_2498[0] != local_2488) {
    operator_delete(local_2498[0],local_2488[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2d88);
  if (local_2478[0] != local_2468) {
    operator_delete(local_2478[0],local_2468[0] + 1);
  }
  if (local_2458.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_2458.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
               + 0x10U)) {
    operator_delete(local_2458.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_2458.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2d68);
  if (local_2438[0] != local_2428) {
    operator_delete(local_2438[0],local_2428[0] + 1);
  }
  if (local_2418[0] != (pointer)local_2408) {
    operator_delete(local_2418[0],local_2408._0_8_ + 1);
  }
  if (local_1a68[0] != local_1a58) {
    operator_delete(local_1a68[0],local_1a58[0] + 1);
  }
  if (local_1a48[0] != local_1a38) {
    operator_delete(local_1a48[0],local_1a38[0] + 1);
  }
  if (local_19a0[0] != local_1990) {
    operator_delete(local_19a0[0],local_1990[0] + 1);
  }
  if (local_1980[0] != local_1970) {
    operator_delete(local_1980[0],local_1970[0] + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_2cb8);
  lVar17 = 0x528;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_5c0.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl + lVar17));
    if ((long *)(local_620 + lVar17 + 0x50) != *(long **)(local_620 + lVar17 + 0x40)) {
      operator_delete(*(long **)(local_620 + lVar17 + 0x40),*(long *)(local_620 + lVar17 + 0x50) + 1
                     );
    }
    if ((long *)(local_620 + lVar17 + 0x28) != *(long **)(local_620 + lVar17 + 0x18)) {
      operator_delete(*(long **)(local_620 + lVar17 + 0x18),*(long *)(local_620 + lVar17 + 0x28) + 1
                     );
    }
    std::__detail::__variant::
    _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
    ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                         *)(local_678 + lVar17 + 0x10));
    std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
              ((vector<RPCArg,_std::allocator<RPCArg>_> *)(auStack_680 + lVar17));
    if ((long *)((long)local_698 + lVar17) != *(long **)(local_6b8 + lVar17 + 0x10)) {
      operator_delete(*(long **)(local_6b8 + lVar17 + 0x10),*(long *)((long)local_698 + lVar17) + 1)
      ;
    }
    lVar17 = lVar17 + -0x108;
  } while (lVar17 != 0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_18b0);
  if (local_18d0[0] != local_18c0) {
    operator_delete(local_18d0[0],local_18c0[0] + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_2cf8);
  lVar17 = 0x528;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_1298.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl + lVar17));
    if ((long *)(local_12f8 + lVar17 + 0x50) != *(long **)(local_12f8 + lVar17 + 0x40)) {
      operator_delete(*(long **)(local_12f8 + lVar17 + 0x40),
                      *(long *)(local_12f8 + lVar17 + 0x50) + 1);
    }
    if ((long *)(local_12f8 + lVar17 + 0x28) != *(long **)(local_12f8 + lVar17 + 0x18)) {
      operator_delete(*(long **)(local_12f8 + lVar17 + 0x18),
                      *(long *)(local_12f8 + lVar17 + 0x28) + 1);
    }
    std::__detail::__variant::
    _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
    ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                         *)(local_1350 + lVar17 + 0x10));
    std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
              ((vector<RPCArg,_std::allocator<RPCArg>_> *)(local_1370 + lVar17 + 0x18));
    if ((long *)(local_1370 + lVar17) != *(long **)((long)local_1380 + lVar17)) {
      operator_delete(*(long **)((long)local_1380 + lVar17),*(long *)(local_1370 + lVar17) + 1);
    }
    lVar17 = lVar17 + -0x108;
  } while (lVar17 != 0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1868);
  if (local_1888 != &local_1878) {
    operator_delete(local_1888,CONCAT71(uStack_1877,local_1878) + 1);
  }
  if (local_1848[0] != local_1838) {
    operator_delete(local_1848[0],local_1838[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_17d0._M_first);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_1828.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1828.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1828.val._M_dataplus._M_p != &local_1828.val.field_2) {
    operator_delete(local_1828.val._M_dataplus._M_p,
                    CONCAT71(local_1828.val.field_2._M_allocated_capacity._1_7_,
                             local_1828.val.field_2._M_local_buf[0]) + 1);
  }
  if (local_1770[0] != local_1760) {
    operator_delete(local_1770[0],local_1760[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1728);
  if (local_1748 != &local_1738) {
    operator_delete(local_1748,CONCAT71(uStack_1737,local_1738) + 1);
  }
  if (local_16e8 != &local_16d8) {
    operator_delete(local_16e8,local_16d8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1708._M_dataplus._M_p != &local_1708.field_2) {
    operator_delete(local_1708._M_dataplus._M_p,local_1708.field_2._M_allocated_capacity + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_16a8._M_first);
  if (local_16c8 != &local_16b8) {
    operator_delete(local_16c8,CONCAT71(uStack_16b7,local_16b8) + 1);
  }
  if (local_1648[0] != local_1638) {
    operator_delete(local_1648[0],local_1638[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1600);
  if (local_1620 != &local_1610) {
    operator_delete(local_1620,CONCAT71(uStack_160f,local_1610) + 1);
  }
  if (local_15e0[0] != local_15d0) {
    operator_delete(local_15e0[0],local_15d0[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_15a0._M_first);
  if (local_15c0 != &local_15b0) {
    operator_delete(local_15c0,CONCAT44(uStack_15ac,local_15b0) + 1);
  }
  if (local_1540[0] != local_1530) {
    operator_delete(local_1540[0],local_1530[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_14f8);
  if (local_1518 != &local_1508) {
    operator_delete(local_1518,CONCAT71(uStack_1507,local_1508) + 1);
  }
  if (local_14b8 != &local_14a8) {
    operator_delete(local_14b8,local_14a8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_14d8._M_dataplus._M_p != &local_14d8.field_2) {
    operator_delete(local_14d8._M_dataplus._M_p,local_14d8.field_2._M_allocated_capacity + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_1478._M_first);
  if (local_1498 != &local_1488) {
    operator_delete(local_1498,CONCAT71(uStack_1487,local_1488) + 1);
  }
  if (local_1418[0] != local_1408) {
    operator_delete(local_1418[0],local_1408[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_13d0);
  if (local_13f0 != &local_13e0) {
    operator_delete(local_13f0,CONCAT71(uStack_13df,local_13e0) + 1);
  }
  if (local_1390 != local_1380) {
    operator_delete(local_1390,local_1380[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_13b0._M_dataplus._M_p != &local_13b0.field_2) {
    operator_delete(local_13b0._M_dataplus._M_p,local_13b0.field_2._M_allocated_capacity + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)local_12f8);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_1310);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1328);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1350._8_8_ != &local_1338) {
    operator_delete((void *)local_1350._8_8_,
                    CONCAT71(local_1338._M_allocated_capacity._1_7_,local_1338._M_local_buf[0]) + 1)
    ;
  }
  if ((undefined1 *)local_1370._0_8_ != local_1370 + 0x10) {
    operator_delete((void *)local_1370._0_8_,local_1370._16_8_ + 1);
  }
  if (local_1298.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)((long)&local_1298.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl + 0x10U)) {
    operator_delete(local_1298.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((local_1298.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  if (local_d50[0] != local_d40) {
    operator_delete(local_d50[0],local_d40[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_d30._M_first);
  if (local_cd0[0] != local_cc0) {
    operator_delete(local_cd0[0],local_cc0[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_c88);
  if (local_ca8 != &local_c98) {
    operator_delete(local_ca8,CONCAT71(uStack_c97,local_c98) + 1);
  }
  if (local_c68[0] != local_c58) {
    operator_delete(local_c68[0],local_c58[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_bf0._M_first);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_c48.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c48.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c48.val._M_dataplus._M_p != &local_c48.val.field_2) {
    operator_delete(local_c48.val._M_dataplus._M_p,
                    CONCAT71(local_c48.val.field_2._M_allocated_capacity._1_7_,
                             local_c48.val.field_2._M_local_buf[0]) + 1);
  }
  if (local_b90[0] != local_b80) {
    operator_delete(local_b90[0],local_b80[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_b48);
  if (local_b68 != &local_b58) {
    operator_delete(local_b68,CONCAT71(uStack_b57,local_b58) + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_2cd8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a40.m_opts.type_str);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a40.m_opts.oneline_description._M_dataplus._M_p !=
      &local_a40.m_opts.oneline_description.field_2) {
    operator_delete(local_a40.m_opts.oneline_description._M_dataplus._M_p,
                    local_a40.m_opts.oneline_description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a40.m_description._M_dataplus._M_p != &local_a40.m_description.field_2) {
    operator_delete(local_a40.m_description._M_dataplus._M_p,
                    local_a40.m_description.field_2._M_allocated_capacity + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_a40.m_fallback);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_a40.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a40.m_names._M_dataplus._M_p != &local_a40.m_names.field_2) {
    operator_delete(local_a40.m_names._M_dataplus._M_p,
                    local_a40.m_names.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_b00);
  if (local_b20 != &local_b10) {
    operator_delete(local_b20,CONCAT71(uStack_b0f,local_b10) + 1);
  }
  if (local_ae0[0] != local_ad0) {
    operator_delete(local_ae0[0],local_ad0[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_ac0._M_first);
  if (local_a60[0] != local_a50) {
    operator_delete(local_a60[0],local_a50[0] + 1);
  }
  if (local_938[0] != local_928) {
    operator_delete(local_938[0],local_928[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_8a0._M_first);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&vStack_8b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_8d0);
  if (local_8f0 != &local_8e0) {
    operator_delete(local_8f0,CONCAT71(uStack_8df,local_8e0) + 1);
  }
  if (local_918 != &local_908) {
    operator_delete(local_918,CONCAT71(uStack_907,local_908) + 1);
  }
  if (local_840[0] != local_830) {
    operator_delete(local_840[0],local_830[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_7f8);
  if (local_818 != &local_808) {
    operator_delete(local_818,CONCAT71(uStack_807,local_808) + 1);
  }
  if (local_7d8[0] != local_7c8) {
    operator_delete(local_7d8[0],local_7c8[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_760._M_first);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_7b8.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_7b8.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b8.val._M_dataplus._M_p != &local_7b8.val.field_2) {
    operator_delete(local_7b8.val._M_dataplus._M_p,
                    CONCAT71(local_7b8.val.field_2._M_allocated_capacity._1_7_,
                             local_7b8.val.field_2._M_local_buf[0]) + 1);
  }
  if (local_700[0] != local_6f0) {
    operator_delete(local_700[0],local_6f0[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_6b8);
  if (local_6d8 != &local_6c8) {
    operator_delete(local_6d8,CONCAT71(uStack_6c7,local_6c8) + 1);
  }
  if (local_698[0] != &local_688) {
    operator_delete(local_698[0],local_688 + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)local_620);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_638);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_650);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_678._8_8_ != &local_660) {
    operator_delete((void *)local_678._8_8_,
                    CONCAT71(local_660._M_allocated_capacity._1_7_,local_660._M_local_buf[0]) + 1);
  }
  if (local_5c0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)((long)&local_5c0.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl + 0x10U)) {
    operator_delete(local_5c0.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((local_5c0.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if ((_Manager_type *)local_58._M_unused._0_8_ != local_48) {
    operator_delete(local_58._M_unused._M_object,(ulong)(local_48[0] + 1));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

RPCHelpMan listunspent()
{
    return RPCHelpMan{
                "listunspent",
                "\nReturns array of unspent transaction outputs\n"
                "with between minconf and maxconf (inclusive) confirmations.\n"
                "Optionally filter to only include txouts paid to specified addresses.\n",
                {
                    {"minconf", RPCArg::Type::NUM, RPCArg::Default{1}, "The minimum confirmations to filter"},
                    {"maxconf", RPCArg::Type::NUM, RPCArg::Default{9999999}, "The maximum confirmations to filter"},
                    {"addresses", RPCArg::Type::ARR, RPCArg::Default{UniValue::VARR}, "The bitcoin addresses to filter",
                        {
                            {"address", RPCArg::Type::STR, RPCArg::Optional::OMITTED, "bitcoin address"},
                        },
                    },
                    {"include_unsafe", RPCArg::Type::BOOL, RPCArg::Default{true}, "Include outputs that are not safe to spend\n"
                              "See description of \"safe\" attribute below."},
                    {"query_options", RPCArg::Type::OBJ_NAMED_PARAMS, RPCArg::Optional::OMITTED, "",
                        {
                            {"minimumAmount", RPCArg::Type::AMOUNT, RPCArg::Default{FormatMoney(0)}, "Minimum value of each UTXO in " + CURRENCY_UNIT + ""},
                            {"maximumAmount", RPCArg::Type::AMOUNT, RPCArg::DefaultHint{"unlimited"}, "Maximum value of each UTXO in " + CURRENCY_UNIT + ""},
                            {"maximumCount", RPCArg::Type::NUM, RPCArg::DefaultHint{"unlimited"}, "Maximum number of UTXOs"},
                            {"minimumSumAmount", RPCArg::Type::AMOUNT, RPCArg::DefaultHint{"unlimited"}, "Minimum sum value of all UTXOs in " + CURRENCY_UNIT + ""},
                            {"include_immature_coinbase", RPCArg::Type::BOOL, RPCArg::Default{false}, "Include immature coinbase UTXOs"}
                        },
                        RPCArgOptions{.oneline_description="query_options"}},
                },
                RPCResult{
                    RPCResult::Type::ARR, "", "",
                    {
                        {RPCResult::Type::OBJ, "", "",
                        {
                            {RPCResult::Type::STR_HEX, "txid", "the transaction id"},
                            {RPCResult::Type::NUM, "vout", "the vout value"},
                            {RPCResult::Type::STR, "address", /*optional=*/true, "the bitcoin address"},
                            {RPCResult::Type::STR, "label", /*optional=*/true, "The associated label, or \"\" for the default label"},
                            {RPCResult::Type::STR, "scriptPubKey", "the output script"},
                            {RPCResult::Type::STR_AMOUNT, "amount", "the transaction output amount in " + CURRENCY_UNIT},
                            {RPCResult::Type::NUM, "confirmations", "The number of confirmations"},
                            {RPCResult::Type::NUM, "ancestorcount", /*optional=*/true, "The number of in-mempool ancestor transactions, including this one (if transaction is in the mempool)"},
                            {RPCResult::Type::NUM, "ancestorsize", /*optional=*/true, "The virtual transaction size of in-mempool ancestors, including this one (if transaction is in the mempool)"},
                            {RPCResult::Type::STR_AMOUNT, "ancestorfees", /*optional=*/true, "The total fees of in-mempool ancestors (including this one) with fee deltas used for mining priority in " + CURRENCY_ATOM + " (if transaction is in the mempool)"},
                            {RPCResult::Type::STR_HEX, "redeemScript", /*optional=*/true, "The redeem script if the output script is P2SH"},
                            {RPCResult::Type::STR, "witnessScript", /*optional=*/true, "witness script if the output script is P2WSH or P2SH-P2WSH"},
                            {RPCResult::Type::BOOL, "spendable", "Whether we have the private keys to spend this output"},
                            {RPCResult::Type::BOOL, "solvable", "Whether we know how to spend this output, ignoring the lack of keys"},
                            {RPCResult::Type::BOOL, "reused", /*optional=*/true, "(only present if avoid_reuse is set) Whether this output is reused/dirty (sent to an address that was previously spent from)"},
                            {RPCResult::Type::STR, "desc", /*optional=*/true, "(only when solvable) A descriptor for spending this output"},
                            {RPCResult::Type::ARR, "parent_descs", /*optional=*/false, "List of parent descriptors for the output script of this coin.", {
                                {RPCResult::Type::STR, "desc", "The descriptor string."},
                            }},
                            {RPCResult::Type::BOOL, "safe", "Whether this output is considered safe to spend. Unconfirmed transactions\n"
                                                            "from outside keys and unconfirmed replacement transactions are considered unsafe\n"
                                                            "and are not eligible for spending by fundrawtransaction and sendtoaddress."},
                        }},
                    }
                },
                RPCExamples{
                    HelpExampleCli("listunspent", "")
            + HelpExampleCli("listunspent", "6 9999999 \"[\\\"" + EXAMPLE_ADDRESS[0] + "\\\",\\\"" + EXAMPLE_ADDRESS[1] + "\\\"]\"")
            + HelpExampleRpc("listunspent", "6, 9999999 \"[\\\"" + EXAMPLE_ADDRESS[0] + "\\\",\\\"" + EXAMPLE_ADDRESS[1] + "\\\"]\"")
            + HelpExampleCli("listunspent", "6 9999999 '[]' true '{ \"minimumAmount\": 0.005 }'")
            + HelpExampleRpc("listunspent", "6, 9999999, [] , true, { \"minimumAmount\": 0.005 } ")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    const std::shared_ptr<const CWallet> pwallet = GetWalletForJSONRPCRequest(request);
    if (!pwallet) return UniValue::VNULL;

    int nMinDepth = 1;
    if (!request.params[0].isNull()) {
        nMinDepth = request.params[0].getInt<int>();
    }

    int nMaxDepth = 9999999;
    if (!request.params[1].isNull()) {
        nMaxDepth = request.params[1].getInt<int>();
    }

    std::set<CTxDestination> destinations;
    if (!request.params[2].isNull()) {
        UniValue inputs = request.params[2].get_array();
        for (unsigned int idx = 0; idx < inputs.size(); idx++) {
            const UniValue& input = inputs[idx];
            CTxDestination dest = DecodeDestination(input.get_str());
            if (!IsValidDestination(dest)) {
                throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, std::string("Invalid Bitcoin address: ") + input.get_str());
            }
            if (!destinations.insert(dest).second) {
                throw JSONRPCError(RPC_INVALID_PARAMETER, std::string("Invalid parameter, duplicated address: ") + input.get_str());
            }
        }
    }

    bool include_unsafe = true;
    if (!request.params[3].isNull()) {
        include_unsafe = request.params[3].get_bool();
    }

    CoinFilterParams filter_coins;
    filter_coins.min_amount = 0;

    if (!request.params[4].isNull()) {
        const UniValue& options = request.params[4].get_obj();

        RPCTypeCheckObj(options,
            {
                {"minimumAmount", UniValueType()},
                {"maximumAmount", UniValueType()},
                {"minimumSumAmount", UniValueType()},
                {"maximumCount", UniValueType(UniValue::VNUM)},
                {"include_immature_coinbase", UniValueType(UniValue::VBOOL)}
            },
            true, true);

        if (options.exists("minimumAmount"))
            filter_coins.min_amount = AmountFromValue(options["minimumAmount"]);

        if (options.exists("maximumAmount"))
            filter_coins.max_amount = AmountFromValue(options["maximumAmount"]);

        if (options.exists("minimumSumAmount"))
            filter_coins.min_sum_amount = AmountFromValue(options["minimumSumAmount"]);

        if (options.exists("maximumCount"))
            filter_coins.max_count = options["maximumCount"].getInt<int64_t>();

        if (options.exists("include_immature_coinbase")) {
            filter_coins.include_immature_coinbase = options["include_immature_coinbase"].get_bool();
        }
    }

    // Make sure the results are valid at least up to the most recent block
    // the user could have gotten from another RPC command prior to now
    pwallet->BlockUntilSyncedToCurrentChain();

    UniValue results(UniValue::VARR);
    std::vector<COutput> vecOutputs;
    {
        CCoinControl cctl;
        cctl.m_avoid_address_reuse = false;
        cctl.m_min_depth = nMinDepth;
        cctl.m_max_depth = nMaxDepth;
        cctl.m_include_unsafe_inputs = include_unsafe;
        LOCK(pwallet->cs_wallet);
        vecOutputs = AvailableCoinsListUnspent(*pwallet, &cctl, filter_coins).All();
    }

    LOCK(pwallet->cs_wallet);

    const bool avoid_reuse = pwallet->IsWalletFlagSet(WALLET_FLAG_AVOID_REUSE);

    for (const COutput& out : vecOutputs) {
        CTxDestination address;
        const CScript& scriptPubKey = out.txout.scriptPubKey;
        bool fValidAddress = ExtractDestination(scriptPubKey, address);
        bool reused = avoid_reuse && pwallet->IsSpentKey(scriptPubKey);

        if (destinations.size() && (!fValidAddress || !destinations.count(address)))
            continue;

        UniValue entry(UniValue::VOBJ);
        entry.pushKV("txid", out.outpoint.hash.GetHex());
        entry.pushKV("vout", (int)out.outpoint.n);

        if (fValidAddress) {
            entry.pushKV("address", EncodeDestination(address));

            const auto* address_book_entry = pwallet->FindAddressBookEntry(address);
            if (address_book_entry) {
                entry.pushKV("label", address_book_entry->GetLabel());
            }

            std::unique_ptr<SigningProvider> provider = pwallet->GetSolvingProvider(scriptPubKey);
            if (provider) {
                if (scriptPubKey.IsPayToScriptHash()) {
                    const CScriptID hash = ToScriptID(std::get<ScriptHash>(address));
                    CScript redeemScript;
                    if (provider->GetCScript(hash, redeemScript)) {
                        entry.pushKV("redeemScript", HexStr(redeemScript));
                        // Now check if the redeemScript is actually a P2WSH script
                        CTxDestination witness_destination;
                        if (redeemScript.IsPayToWitnessScriptHash()) {
                            bool extracted = ExtractDestination(redeemScript, witness_destination);
                            CHECK_NONFATAL(extracted);
                            // Also return the witness script
                            const WitnessV0ScriptHash& whash = std::get<WitnessV0ScriptHash>(witness_destination);
                            CScriptID id{RIPEMD160(whash)};
                            CScript witnessScript;
                            if (provider->GetCScript(id, witnessScript)) {
                                entry.pushKV("witnessScript", HexStr(witnessScript));
                            }
                        }
                    }
                } else if (scriptPubKey.IsPayToWitnessScriptHash()) {
                    const WitnessV0ScriptHash& whash = std::get<WitnessV0ScriptHash>(address);
                    CScriptID id{RIPEMD160(whash)};
                    CScript witnessScript;
                    if (provider->GetCScript(id, witnessScript)) {
                        entry.pushKV("witnessScript", HexStr(witnessScript));
                    }
                }
            }
        }

        entry.pushKV("scriptPubKey", HexStr(scriptPubKey));
        entry.pushKV("amount", ValueFromAmount(out.txout.nValue));
        entry.pushKV("confirmations", out.depth);
        if (!out.depth) {
            size_t ancestor_count, descendant_count, ancestor_size;
            CAmount ancestor_fees;
            pwallet->chain().getTransactionAncestry(out.outpoint.hash, ancestor_count, descendant_count, &ancestor_size, &ancestor_fees);
            if (ancestor_count) {
                entry.pushKV("ancestorcount", uint64_t(ancestor_count));
                entry.pushKV("ancestorsize", uint64_t(ancestor_size));
                entry.pushKV("ancestorfees", uint64_t(ancestor_fees));
            }
        }
        entry.pushKV("spendable", out.spendable);
        entry.pushKV("solvable", out.solvable);
        if (out.solvable) {
            std::unique_ptr<SigningProvider> provider = pwallet->GetSolvingProvider(scriptPubKey);
            if (provider) {
                auto descriptor = InferDescriptor(scriptPubKey, *provider);
                entry.pushKV("desc", descriptor->ToString());
            }
        }
        PushParentDescriptors(*pwallet, scriptPubKey, entry);
        if (avoid_reuse) entry.pushKV("reused", reused);
        entry.pushKV("safe", out.safe);
        results.push_back(std::move(entry));
    }

    return results;
},
    };
}